

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  uint uVar64;
  uint uVar65;
  long lVar66;
  ulong uVar67;
  uint uVar68;
  ulong uVar69;
  uint uVar70;
  ulong uVar71;
  bool bVar72;
  float fVar73;
  float fVar74;
  float fVar101;
  float fVar103;
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar105;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar110;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar138;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar137;
  float fVar139;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar153;
  vint4 ai;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar146 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar184;
  float fVar204;
  float fVar205;
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [28];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar210;
  float fVar211;
  float fVar231;
  float fVar233;
  vint4 ai_2;
  undefined1 auVar212 [16];
  float fVar235;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [28];
  float fVar237;
  float fVar238;
  undefined1 auVar221 [32];
  float fVar232;
  float fVar234;
  float fVar236;
  float fVar239;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar255;
  float fVar258;
  vint4 ai_1;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [28];
  float fVar264;
  float fVar267;
  undefined1 auVar248 [32];
  float fVar256;
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar265;
  float fVar268;
  float fVar270;
  float fVar271;
  float fVar273;
  undefined1 auVar249 [32];
  float fVar257;
  float fVar260;
  float fVar263;
  float fVar266;
  float fVar269;
  float fVar272;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar282;
  undefined1 auVar283 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar296 [32];
  float fVar295;
  undefined1 auVar297 [32];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar298 [64];
  float fVar305;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  float fVar318;
  float fVar323;
  float fVar324;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar330;
  float fVar337;
  float fVar339;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar331;
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  undefined1 auVar354 [28];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c68;
  float local_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 (*local_a28) [16];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_888;
  ulong local_880;
  undefined1 auStack_878 [24];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  undefined1 auStack_6e0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar2 = prim[1];
  uVar71 = (ulong)(byte)PVar2;
  fVar210 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar113 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar111._0_4_ = fVar210 * auVar7._0_4_;
  auVar111._4_4_ = fVar210 * auVar7._4_4_;
  auVar111._8_4_ = fVar210 * auVar7._8_4_;
  auVar111._12_4_ = fVar210 * auVar7._12_4_;
  auVar274._0_4_ = fVar210 * auVar113._0_4_;
  auVar274._4_4_ = fVar210 * auVar113._4_4_;
  auVar274._8_4_ = fVar210 * auVar113._8_4_;
  auVar274._12_4_ = fVar210 * auVar113._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xc + 6)));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x12 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x13 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x14 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar75 = vshufps_avx(auVar274,auVar274,0);
  auVar80 = vshufps_avx(auVar274,auVar274,0x55);
  auVar142 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar210 = auVar142._0_4_;
  fVar158 = auVar142._4_4_;
  fVar231 = auVar142._8_4_;
  fVar176 = auVar142._12_4_;
  fVar282 = auVar80._0_4_;
  fVar287 = auVar80._4_4_;
  fVar288 = auVar80._8_4_;
  fVar289 = auVar80._12_4_;
  fVar233 = auVar75._0_4_;
  fVar177 = auVar75._4_4_;
  fVar235 = auVar75._8_4_;
  fVar178 = auVar75._12_4_;
  auVar319._0_4_ = fVar233 * auVar7._0_4_ + fVar282 * auVar113._0_4_ + fVar210 * auVar12._0_4_;
  auVar319._4_4_ = fVar177 * auVar7._4_4_ + fVar287 * auVar113._4_4_ + fVar158 * auVar12._4_4_;
  auVar319._8_4_ = fVar235 * auVar7._8_4_ + fVar288 * auVar113._8_4_ + fVar231 * auVar12._8_4_;
  auVar319._12_4_ = fVar178 * auVar7._12_4_ + fVar289 * auVar113._12_4_ + fVar176 * auVar12._12_4_;
  auVar332._0_4_ = fVar233 * auVar13._0_4_ + fVar282 * auVar163._0_4_ + auVar14._0_4_ * fVar210;
  auVar332._4_4_ = fVar177 * auVar13._4_4_ + fVar287 * auVar163._4_4_ + auVar14._4_4_ * fVar158;
  auVar332._8_4_ = fVar235 * auVar13._8_4_ + fVar288 * auVar163._8_4_ + auVar14._8_4_ * fVar231;
  auVar332._12_4_ = fVar178 * auVar13._12_4_ + fVar289 * auVar163._12_4_ + auVar14._12_4_ * fVar176;
  auVar275._0_4_ = fVar233 * auVar76._0_4_ + fVar282 * auVar77._0_4_ + auVar112._0_4_ * fVar210;
  auVar275._4_4_ = fVar177 * auVar76._4_4_ + fVar287 * auVar77._4_4_ + auVar112._4_4_ * fVar158;
  auVar275._8_4_ = fVar235 * auVar76._8_4_ + fVar288 * auVar77._8_4_ + auVar112._8_4_ * fVar231;
  auVar275._12_4_ = fVar178 * auVar76._12_4_ + fVar289 * auVar77._12_4_ + auVar112._12_4_ * fVar176;
  auVar75 = vshufps_avx(auVar111,auVar111,0);
  auVar80 = vshufps_avx(auVar111,auVar111,0x55);
  auVar142 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar210 = auVar142._0_4_;
  fVar158 = auVar142._4_4_;
  fVar231 = auVar142._8_4_;
  fVar176 = auVar142._12_4_;
  fVar282 = auVar80._0_4_;
  fVar287 = auVar80._4_4_;
  fVar288 = auVar80._8_4_;
  fVar289 = auVar80._12_4_;
  fVar233 = auVar75._0_4_;
  fVar177 = auVar75._4_4_;
  fVar235 = auVar75._8_4_;
  fVar178 = auVar75._12_4_;
  auVar243._0_4_ = fVar233 * auVar7._0_4_ + fVar282 * auVar113._0_4_ + fVar210 * auVar12._0_4_;
  auVar243._4_4_ = fVar177 * auVar7._4_4_ + fVar287 * auVar113._4_4_ + fVar158 * auVar12._4_4_;
  auVar243._8_4_ = fVar235 * auVar7._8_4_ + fVar288 * auVar113._8_4_ + fVar231 * auVar12._8_4_;
  auVar243._12_4_ = fVar178 * auVar7._12_4_ + fVar289 * auVar113._12_4_ + fVar176 * auVar12._12_4_;
  auVar80._0_4_ = fVar233 * auVar13._0_4_ + auVar14._0_4_ * fVar210 + fVar282 * auVar163._0_4_;
  auVar80._4_4_ = fVar177 * auVar13._4_4_ + auVar14._4_4_ * fVar158 + fVar287 * auVar163._4_4_;
  auVar80._8_4_ = fVar235 * auVar13._8_4_ + auVar14._8_4_ * fVar231 + fVar288 * auVar163._8_4_;
  auVar80._12_4_ = fVar178 * auVar13._12_4_ + auVar14._12_4_ * fVar176 + fVar289 * auVar163._12_4_;
  auVar75._0_4_ = fVar282 * auVar77._0_4_ + auVar112._0_4_ * fVar210 + fVar233 * auVar76._0_4_;
  auVar75._4_4_ = fVar287 * auVar77._4_4_ + auVar112._4_4_ * fVar158 + fVar177 * auVar76._4_4_;
  auVar75._8_4_ = fVar288 * auVar77._8_4_ + auVar112._8_4_ * fVar231 + fVar235 * auVar76._8_4_;
  auVar75._12_4_ = fVar289 * auVar77._12_4_ + auVar112._12_4_ * fVar176 + fVar178 * auVar76._12_4_;
  auVar212._8_4_ = 0x7fffffff;
  auVar212._0_8_ = 0x7fffffff7fffffff;
  auVar212._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar319,auVar212);
  auVar86._8_4_ = 0x219392ef;
  auVar86._0_8_ = 0x219392ef219392ef;
  auVar86._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar86,1);
  auVar113 = vblendvps_avx(auVar319,auVar86,auVar7);
  auVar7 = vandps_avx(auVar332,auVar212);
  auVar7 = vcmpps_avx(auVar7,auVar86,1);
  auVar12 = vblendvps_avx(auVar332,auVar86,auVar7);
  auVar7 = vandps_avx(auVar275,auVar212);
  auVar7 = vcmpps_avx(auVar7,auVar86,1);
  auVar7 = vblendvps_avx(auVar275,auVar86,auVar7);
  auVar13 = vrcpps_avx(auVar113);
  fVar282 = auVar13._0_4_;
  auVar142._0_4_ = fVar282 * auVar113._0_4_;
  fVar287 = auVar13._4_4_;
  auVar142._4_4_ = fVar287 * auVar113._4_4_;
  fVar288 = auVar13._8_4_;
  auVar142._8_4_ = fVar288 * auVar113._8_4_;
  fVar289 = auVar13._12_4_;
  auVar142._12_4_ = fVar289 * auVar113._12_4_;
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = 0x3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar113 = vsubps_avx(auVar276,auVar142);
  fVar282 = fVar282 + fVar282 * auVar113._0_4_;
  fVar287 = fVar287 + fVar287 * auVar113._4_4_;
  fVar288 = fVar288 + fVar288 * auVar113._8_4_;
  fVar289 = fVar289 + fVar289 * auVar113._12_4_;
  auVar113 = vrcpps_avx(auVar12);
  fVar210 = auVar113._0_4_;
  auVar185._0_4_ = fVar210 * auVar12._0_4_;
  fVar231 = auVar113._4_4_;
  auVar185._4_4_ = fVar231 * auVar12._4_4_;
  fVar233 = auVar113._8_4_;
  auVar185._8_4_ = fVar233 * auVar12._8_4_;
  fVar235 = auVar113._12_4_;
  auVar185._12_4_ = fVar235 * auVar12._12_4_;
  auVar113 = vsubps_avx(auVar276,auVar185);
  fVar210 = fVar210 + fVar210 * auVar113._0_4_;
  fVar231 = fVar231 + fVar231 * auVar113._4_4_;
  fVar233 = fVar233 + fVar233 * auVar113._8_4_;
  fVar235 = fVar235 + fVar235 * auVar113._12_4_;
  auVar113 = vrcpps_avx(auVar7);
  fVar158 = auVar113._0_4_;
  auVar82._0_4_ = fVar158 * auVar7._0_4_;
  fVar176 = auVar113._4_4_;
  auVar82._4_4_ = fVar176 * auVar7._4_4_;
  fVar177 = auVar113._8_4_;
  auVar82._8_4_ = fVar177 * auVar7._8_4_;
  fVar178 = auVar113._12_4_;
  auVar82._12_4_ = fVar178 * auVar7._12_4_;
  auVar7 = vsubps_avx(auVar276,auVar82);
  fVar158 = fVar158 + fVar158 * auVar7._0_4_;
  fVar176 = fVar176 + fVar176 * auVar7._4_4_;
  fVar177 = fVar177 + fVar177 * auVar7._8_4_;
  fVar178 = fVar178 + fVar178 * auVar7._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar243);
  auVar140._0_4_ = fVar282 * auVar7._0_4_;
  auVar140._4_4_ = fVar287 * auVar7._4_4_;
  auVar140._8_4_ = fVar288 * auVar7._8_4_;
  auVar140._12_4_ = fVar289 * auVar7._12_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar113);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar243);
  auVar186._0_4_ = fVar282 * auVar7._0_4_;
  auVar186._4_4_ = fVar287 * auVar7._4_4_;
  auVar186._8_4_ = fVar288 * auVar7._8_4_;
  auVar186._12_4_ = fVar289 * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar71 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar80);
  auVar244._0_4_ = auVar7._0_4_ * fVar210;
  auVar244._4_4_ = auVar7._4_4_ * fVar231;
  auVar244._8_4_ = auVar7._8_4_ * fVar233;
  auVar244._12_4_ = auVar7._12_4_ * fVar235;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar13);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar113 = vsubps_avx(auVar7,auVar80);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar71 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar163);
  auVar112._0_4_ = fVar210 * auVar113._0_4_;
  auVar112._4_4_ = fVar231 * auVar113._4_4_;
  auVar112._8_4_ = fVar233 * auVar113._8_4_;
  auVar112._12_4_ = fVar235 * auVar113._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar75);
  auVar213._0_4_ = auVar7._0_4_ * fVar158;
  auVar213._4_4_ = auVar7._4_4_ * fVar176;
  auVar213._8_4_ = auVar7._8_4_ * fVar177;
  auVar213._12_4_ = auVar7._12_4_ * fVar178;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar14);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar75);
  auVar76._0_4_ = auVar7._0_4_ * fVar158;
  auVar76._4_4_ = auVar7._4_4_ * fVar176;
  auVar76._8_4_ = auVar7._8_4_ * fVar177;
  auVar76._12_4_ = auVar7._12_4_ * fVar178;
  auVar7 = vpminsd_avx(auVar140,auVar186);
  auVar113 = vpminsd_avx(auVar244,auVar112);
  auVar7 = vmaxps_avx(auVar7,auVar113);
  auVar113 = vpminsd_avx(auVar213,auVar76);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar292._4_4_ = uVar1;
  auVar292._0_4_ = uVar1;
  auVar292._8_4_ = uVar1;
  auVar292._12_4_ = uVar1;
  auVar113 = vmaxps_avx(auVar113,auVar292);
  auVar7 = vmaxps_avx(auVar7,auVar113);
  local_5e0._0_4_ = auVar7._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar7._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar7._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar140,auVar186);
  auVar113 = vpmaxsd_avx(auVar244,auVar112);
  auVar7 = vminps_avx(auVar7,auVar113);
  auVar113 = vpmaxsd_avx(auVar213,auVar76);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar141._4_4_ = uVar1;
  auVar141._0_4_ = uVar1;
  auVar141._8_4_ = uVar1;
  auVar141._12_4_ = uVar1;
  auVar113 = vminps_avx(auVar113,auVar141);
  auVar7 = vminps_avx(auVar7,auVar113);
  auVar77._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar77._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar77._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar77._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar7 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar113 = vpcmpgtd_avx(auVar7,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_5e0,auVar77,2);
  auVar7 = vandps_avx(auVar7,auVar113);
  uVar64 = vmovmskps_avx(auVar7);
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_4e0 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  local_a28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_888 = prim;
LAB_0083556e:
  uVar71 = (ulong)uVar64;
  if (uVar71 == 0) {
    return;
  }
  lVar66 = 0;
  if (uVar71 != 0) {
    for (; (uVar64 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
    }
  }
  uVar71 = uVar71 - 1 & uVar71;
  uVar64 = *(uint *)(local_888 + 2);
  local_880 = (ulong)*(uint *)(local_888 + lVar66 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar64].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_880);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar5 = *(long *)&pGVar3[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar5 + (long)p_Var4 * uVar69);
  auVar113 = *(undefined1 (*) [16])(lVar5 + (uVar69 + 1) * (long)p_Var4);
  auVar12 = *(undefined1 (*) [16])(lVar5 + (uVar69 + 2) * (long)p_Var4);
  lVar6 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar13 = *(undefined1 (*) [16])(lVar5 + (uVar69 + 3) * (long)p_Var4);
  if (((uVar71 != 0) && (uVar69 = uVar71 - 1 & uVar71, uVar69 != 0)) && (lVar5 = 0, uVar69 != 0)) {
    for (; (uVar69 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar14 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar210 = *(float *)(ray + k * 4 + 0x40);
  auVar320._4_4_ = fVar210;
  auVar320._0_4_ = fVar210;
  auVar320._8_4_ = fVar210;
  auVar320._12_4_ = fVar210;
  fStack_a10 = fVar210;
  _local_a20 = auVar320;
  fStack_a0c = fVar210;
  fStack_a08 = fVar210;
  fStack_a04 = fVar210;
  fVar158 = *(float *)(ray + k * 4 + 0x50);
  auVar333._4_4_ = fVar158;
  auVar333._0_4_ = fVar158;
  auVar333._8_4_ = fVar158;
  auVar333._12_4_ = fVar158;
  fStack_690 = fVar158;
  _local_6a0 = auVar333;
  fStack_68c = fVar158;
  fStack_688 = fVar158;
  fStack_684 = fVar158;
  auVar163 = vunpcklps_avx(auVar320,auVar333);
  fVar231 = *(float *)(ray + k * 4 + 0x60);
  auVar350._4_4_ = fVar231;
  auVar350._0_4_ = fVar231;
  auVar350._8_4_ = fVar231;
  auVar350._12_4_ = fVar231;
  fStack_830 = fVar231;
  _local_840 = auVar350;
  fStack_82c = fVar231;
  fStack_828 = fVar231;
  fStack_824 = fVar231;
  _local_9b0 = vinsertps_avx(auVar163,auVar350,0x28);
  auVar78._0_4_ = (auVar7._0_4_ + auVar113._0_4_ + auVar12._0_4_ + auVar13._0_4_) * 0.25;
  auVar78._4_4_ = (auVar7._4_4_ + auVar113._4_4_ + auVar12._4_4_ + auVar13._4_4_) * 0.25;
  auVar78._8_4_ = (auVar7._8_4_ + auVar113._8_4_ + auVar12._8_4_ + auVar13._8_4_) * 0.25;
  auVar78._12_4_ = (auVar7._12_4_ + auVar113._12_4_ + auVar12._12_4_ + auVar13._12_4_) * 0.25;
  auVar163 = vsubps_avx(auVar78,auVar14);
  auVar163 = vdpps_avx(auVar163,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar76 = vrcpss_avx(local_9c0,local_9c0);
  fVar176 = auVar163._0_4_ * auVar76._0_4_ * (2.0 - local_9c0._0_4_ * auVar76._0_4_);
  auVar76 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
  auVar214._0_4_ = auVar14._0_4_ + local_9b0._0_4_ * auVar76._0_4_;
  auVar214._4_4_ = auVar14._4_4_ + local_9b0._4_4_ * auVar76._4_4_;
  auVar214._8_4_ = auVar14._8_4_ + local_9b0._8_4_ * auVar76._8_4_;
  auVar214._12_4_ = auVar14._12_4_ + local_9b0._12_4_ * auVar76._12_4_;
  auVar163 = vblendps_avx(auVar214,_DAT_01f45a50,8);
  auVar14 = vsubps_avx(auVar7,auVar163);
  auVar77 = vsubps_avx(auVar12,auVar163);
  auVar112 = vsubps_avx(auVar113,auVar163);
  auVar13 = vsubps_avx(auVar13,auVar163);
  auVar7 = vshufps_avx(auVar14,auVar14,0);
  register0x00001250 = auVar7;
  _local_1e0 = auVar7;
  auVar7 = vshufps_avx(auVar14,auVar14,0x55);
  local_9e0._16_16_ = auVar7;
  local_9e0._0_16_ = auVar7;
  auVar7 = vshufps_avx(auVar14,auVar14,0xaa);
  local_360._16_16_ = auVar7;
  local_360._0_16_ = auVar7;
  auVar7 = vshufps_avx(auVar14,auVar14,0xff);
  auVar113 = vshufps_avx(auVar112,auVar112,0);
  auVar248._16_16_ = auVar113;
  auVar248._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar112,auVar112,0x55);
  local_920._16_16_ = auVar113;
  local_920._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar112,auVar112,0xaa);
  auVar310._16_16_ = auVar113;
  auVar310._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar112,auVar112,0xff);
  local_960._16_16_ = auVar113;
  local_960._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar77,auVar77,0);
  local_380._16_16_ = auVar113;
  local_380._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar77,auVar77,0x55);
  local_3a0._16_16_ = auVar113;
  local_3a0._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar77,auVar77,0xaa);
  register0x00001290 = auVar113;
  _local_200 = auVar113;
  auVar113 = vshufps_avx(auVar77,auVar77,0xff);
  auVar254 = ZEXT3264(local_960);
  register0x00001290 = auVar113;
  _local_220 = auVar113;
  auVar113 = vshufps_avx(auVar13,auVar13,0);
  register0x00001290 = auVar113;
  _local_240 = auVar113;
  auVar113 = vshufps_avx(auVar13,auVar13,0x55);
  register0x00001290 = auVar113;
  _local_260 = auVar113;
  auVar113 = vshufps_avx(auVar13,auVar13,0xaa);
  register0x00001290 = auVar113;
  _local_280 = auVar113;
  auVar113 = vshufps_avx(auVar13,auVar13,0xff);
  register0x00001290 = auVar113;
  _local_2a0 = auVar113;
  auVar113 = ZEXT416((uint)(fVar210 * fVar210 + fVar158 * fVar158 + fVar231 * fVar231));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  local_2c0._16_16_ = auVar113;
  local_2c0._0_16_ = auVar113;
  fVar210 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)fVar176);
  auVar353 = ZEXT3264(local_920);
  auVar113 = vshufps_avx(ZEXT416((uint)(fVar210 - fVar176)),ZEXT416((uint)(fVar210 - fVar176)),0);
  local_3c0._16_16_ = auVar113;
  local_3c0._0_16_ = auVar113;
  local_770 = vpshufd_avx(ZEXT416(uVar64),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_888 + lVar66 * 4 + 6)),0);
  register0x00001210 = auVar76;
  _local_860 = auVar76;
  uVar69 = 0;
  local_c68 = 1;
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_2c0,auVar90);
  auVar113 = vsqrtss_avx(local_9c0,local_9c0);
  auVar12 = vsqrtss_avx(local_9c0,local_9c0);
  auVar298 = ZEXT3264(local_9e0);
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_560 = auVar248;
  local_aa0 = auVar310;
  do {
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = 0x3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar221._16_4_ = 0x3f800000;
    auVar221._20_4_ = 0x3f800000;
    auVar221._24_4_ = 0x3f800000;
    auVar221._28_4_ = 0x3f800000;
    auVar163 = vmovshdup_avx(local_5d0);
    auVar75 = vsubps_avx(auVar163,local_5d0);
    auVar163 = vshufps_avx(local_5d0,local_5d0,0);
    local_7a0._16_16_ = auVar163;
    local_7a0._0_16_ = auVar163;
    auVar76 = vshufps_avx(auVar75,auVar75,0);
    fVar110 = auVar76._0_4_;
    fVar137 = auVar76._4_4_;
    fVar138 = auVar76._8_4_;
    fVar139 = auVar76._12_4_;
    fVar73 = auVar163._0_4_;
    auVar127._0_4_ = fVar73 + fVar110 * 0.0;
    fVar101 = auVar163._4_4_;
    auVar127._4_4_ = fVar101 + fVar137 * 0.14285715;
    fVar103 = auVar163._8_4_;
    auVar127._8_4_ = fVar103 + fVar138 * 0.2857143;
    fVar105 = auVar163._12_4_;
    auVar127._12_4_ = fVar105 + fVar139 * 0.42857146;
    auVar127._16_4_ = fVar73 + fVar110 * 0.5714286;
    auVar127._20_4_ = fVar101 + fVar137 * 0.71428573;
    auVar127._24_4_ = fVar103 + fVar138 * 0.8571429;
    auVar127._28_4_ = fVar105 + fVar139;
    auVar89 = vsubps_avx(auVar221,auVar127);
    fVar231 = auVar89._0_4_;
    fVar176 = auVar89._4_4_;
    fVar233 = auVar89._8_4_;
    fVar177 = auVar89._12_4_;
    fVar235 = auVar89._16_4_;
    fVar178 = auVar89._20_4_;
    fVar282 = auVar89._24_4_;
    fVar183 = auVar254._28_4_ + auVar248._28_4_ + auVar310._28_4_ + 1.0 + 1.0;
    fVar158 = local_360._28_4_;
    fVar240 = local_380._0_4_ * auVar127._0_4_ + auVar248._0_4_ * fVar231;
    fVar255 = local_380._4_4_ * auVar127._4_4_ + auVar248._4_4_ * fVar176;
    fVar258 = local_380._8_4_ * auVar127._8_4_ + auVar248._8_4_ * fVar233;
    fVar261 = local_380._12_4_ * auVar127._12_4_ + auVar248._12_4_ * fVar177;
    fVar264 = local_380._16_4_ * auVar127._16_4_ + auVar248._16_4_ * fVar235;
    fVar267 = local_380._20_4_ * auVar127._20_4_ + auVar248._20_4_ * fVar178;
    fVar270 = local_380._24_4_ * auVar127._24_4_ + auVar248._24_4_ * fVar282;
    fVar287 = local_3a0._0_4_ * auVar127._0_4_ + auVar353._0_4_ * fVar231;
    fVar288 = local_3a0._4_4_ * auVar127._4_4_ + auVar353._4_4_ * fVar176;
    fVar289 = local_3a0._8_4_ * auVar127._8_4_ + auVar353._8_4_ * fVar233;
    fVar179 = local_3a0._12_4_ * auVar127._12_4_ + auVar353._12_4_ * fVar177;
    fVar180 = local_3a0._16_4_ * auVar127._16_4_ + auVar353._16_4_ * fVar235;
    fVar181 = local_3a0._20_4_ * auVar127._20_4_ + auVar353._20_4_ * fVar178;
    fVar182 = local_3a0._24_4_ * auVar127._24_4_ + auVar353._24_4_ * fVar282;
    fVar184 = (float)local_200._0_4_ * auVar127._0_4_ + auVar310._0_4_ * fVar231;
    fVar204 = (float)local_200._4_4_ * auVar127._4_4_ + auVar310._4_4_ * fVar176;
    fVar205 = fStack_1f8 * auVar127._8_4_ + auVar310._8_4_ * fVar233;
    fVar206 = fStack_1f4 * auVar127._12_4_ + auVar310._12_4_ * fVar177;
    fVar207 = fStack_1f0 * auVar127._16_4_ + auVar310._16_4_ * fVar235;
    fVar208 = fStack_1ec * auVar127._20_4_ + auVar310._20_4_ * fVar178;
    fVar209 = fStack_1e8 * auVar127._24_4_ + auVar310._24_4_ * fVar282;
    fVar211 = (float)local_220._0_4_ * auVar127._0_4_ + auVar254._0_4_ * fVar231;
    fVar232 = (float)local_220._4_4_ * auVar127._4_4_ + auVar254._4_4_ * fVar176;
    fVar234 = fStack_218 * auVar127._8_4_ + auVar254._8_4_ * fVar233;
    fVar236 = fStack_214 * auVar127._12_4_ + auVar254._12_4_ * fVar177;
    fVar237 = fStack_210 * auVar127._16_4_ + auVar254._16_4_ * fVar235;
    fVar238 = fStack_20c * auVar127._20_4_ + auVar254._20_4_ * fVar178;
    fVar239 = fStack_208 * auVar127._24_4_ + auVar254._24_4_ * fVar282;
    fVar349 = fVar158 + auVar248._28_4_;
    fVar329 = auVar7._12_4_ + fVar158;
    auVar284._0_4_ =
         fVar231 * (auVar248._0_4_ * auVar127._0_4_ + fVar231 * (float)local_1e0._0_4_) +
         auVar127._0_4_ * fVar240;
    auVar284._4_4_ =
         fVar176 * (auVar248._4_4_ * auVar127._4_4_ + fVar176 * (float)local_1e0._4_4_) +
         auVar127._4_4_ * fVar255;
    auVar284._8_4_ =
         fVar233 * (auVar248._8_4_ * auVar127._8_4_ + fVar233 * fStack_1d8) +
         auVar127._8_4_ * fVar258;
    auVar284._12_4_ =
         fVar177 * (auVar248._12_4_ * auVar127._12_4_ + fVar177 * fStack_1d4) +
         auVar127._12_4_ * fVar261;
    auVar284._16_4_ =
         fVar235 * (auVar248._16_4_ * auVar127._16_4_ + fVar235 * fStack_1d0) +
         auVar127._16_4_ * fVar264;
    auVar284._20_4_ =
         fVar178 * (auVar248._20_4_ * auVar127._20_4_ + fVar178 * fStack_1cc) +
         auVar127._20_4_ * fVar267;
    auVar284._24_4_ =
         fVar282 * (auVar248._24_4_ * auVar127._24_4_ + fVar282 * fStack_1c8) +
         auVar127._24_4_ * fVar270;
    auVar284._28_4_ = local_380._28_4_ + fVar158;
    auVar296._0_4_ =
         fVar231 * (auVar353._0_4_ * auVar127._0_4_ + auVar298._0_4_ * fVar231) +
         auVar127._0_4_ * fVar287;
    auVar296._4_4_ =
         fVar176 * (auVar353._4_4_ * auVar127._4_4_ + auVar298._4_4_ * fVar176) +
         auVar127._4_4_ * fVar288;
    auVar296._8_4_ =
         fVar233 * (auVar353._8_4_ * auVar127._8_4_ + auVar298._8_4_ * fVar233) +
         auVar127._8_4_ * fVar289;
    auVar296._12_4_ =
         fVar177 * (auVar353._12_4_ * auVar127._12_4_ + auVar298._12_4_ * fVar177) +
         auVar127._12_4_ * fVar179;
    auVar296._16_4_ =
         fVar235 * (auVar353._16_4_ * auVar127._16_4_ + auVar298._16_4_ * fVar235) +
         auVar127._16_4_ * fVar180;
    auVar296._20_4_ =
         fVar178 * (auVar353._20_4_ * auVar127._20_4_ + auVar298._20_4_ * fVar178) +
         auVar127._20_4_ * fVar181;
    auVar296._24_4_ =
         fVar282 * (auVar353._24_4_ * auVar127._24_4_ + auVar298._24_4_ * fVar282) +
         auVar127._24_4_ * fVar182;
    auVar296._28_4_ = local_3a0._28_4_ + fVar158;
    auVar306._0_4_ =
         fVar231 * (auVar310._0_4_ * auVar127._0_4_ + local_360._0_4_ * fVar231) +
         auVar127._0_4_ * fVar184;
    auVar306._4_4_ =
         fVar176 * (auVar310._4_4_ * auVar127._4_4_ + local_360._4_4_ * fVar176) +
         auVar127._4_4_ * fVar204;
    auVar306._8_4_ =
         fVar233 * (auVar310._8_4_ * auVar127._8_4_ + local_360._8_4_ * fVar233) +
         auVar127._8_4_ * fVar205;
    auVar306._12_4_ =
         fVar177 * (auVar310._12_4_ * auVar127._12_4_ + local_360._12_4_ * fVar177) +
         auVar127._12_4_ * fVar206;
    auVar306._16_4_ =
         fVar235 * (auVar310._16_4_ * auVar127._16_4_ + local_360._16_4_ * fVar235) +
         auVar127._16_4_ * fVar207;
    auVar306._20_4_ =
         fVar178 * (auVar310._20_4_ * auVar127._20_4_ + local_360._20_4_ * fVar178) +
         auVar127._20_4_ * fVar208;
    auVar306._24_4_ =
         fVar282 * (auVar310._24_4_ * auVar127._24_4_ + local_360._24_4_ * fVar282) +
         auVar127._24_4_ * fVar209;
    auVar306._28_4_ = fStack_1e4 + fVar158;
    auVar278._0_4_ =
         auVar127._0_4_ * fVar211 +
         fVar231 * (auVar254._0_4_ * auVar127._0_4_ + auVar7._0_4_ * fVar231);
    auVar278._4_4_ =
         auVar127._4_4_ * fVar232 +
         fVar176 * (auVar254._4_4_ * auVar127._4_4_ + auVar7._4_4_ * fVar176);
    auVar278._8_4_ =
         auVar127._8_4_ * fVar234 +
         fVar233 * (auVar254._8_4_ * auVar127._8_4_ + auVar7._8_4_ * fVar233);
    auVar278._12_4_ =
         auVar127._12_4_ * fVar236 +
         fVar177 * (auVar254._12_4_ * auVar127._12_4_ + auVar7._12_4_ * fVar177);
    auVar278._16_4_ =
         auVar127._16_4_ * fVar237 +
         fVar235 * (auVar254._16_4_ * auVar127._16_4_ + auVar7._0_4_ * fVar235);
    auVar278._20_4_ =
         auVar127._20_4_ * fVar238 +
         fVar178 * (auVar254._20_4_ * auVar127._20_4_ + auVar7._4_4_ * fVar178);
    auVar278._24_4_ =
         auVar127._24_4_ * fVar239 +
         fVar282 * (auVar254._24_4_ * auVar127._24_4_ + auVar7._8_4_ * fVar282);
    auVar278._28_4_ = fStack_1e4 + fStack_204;
    auVar91._0_4_ =
         (auVar127._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar231) * auVar127._0_4_ +
         fVar231 * fVar240;
    auVar91._4_4_ =
         (auVar127._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar176) * auVar127._4_4_ +
         fVar176 * fVar255;
    auVar91._8_4_ =
         (auVar127._8_4_ * fStack_238 + local_380._8_4_ * fVar233) * auVar127._8_4_ +
         fVar233 * fVar258;
    auVar91._12_4_ =
         (auVar127._12_4_ * fStack_234 + local_380._12_4_ * fVar177) * auVar127._12_4_ +
         fVar177 * fVar261;
    auVar91._16_4_ =
         (auVar127._16_4_ * fStack_230 + local_380._16_4_ * fVar235) * auVar127._16_4_ +
         fVar235 * fVar264;
    auVar91._20_4_ =
         (auVar127._20_4_ * fStack_22c + local_380._20_4_ * fVar178) * auVar127._20_4_ +
         fVar178 * fVar267;
    auVar91._24_4_ =
         (auVar127._24_4_ * fStack_228 + local_380._24_4_ * fVar282) * auVar127._24_4_ +
         fVar282 * fVar270;
    auVar91._28_4_ = fStack_1e4 + fVar183 + auVar254._28_4_;
    auVar172._0_4_ =
         (auVar127._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar231) * auVar127._0_4_ +
         fVar231 * fVar287;
    auVar172._4_4_ =
         (auVar127._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar176) * auVar127._4_4_ +
         fVar176 * fVar288;
    auVar172._8_4_ =
         (auVar127._8_4_ * fStack_258 + local_3a0._8_4_ * fVar233) * auVar127._8_4_ +
         fVar233 * fVar289;
    auVar172._12_4_ =
         (auVar127._12_4_ * fStack_254 + local_3a0._12_4_ * fVar177) * auVar127._12_4_ +
         fVar177 * fVar179;
    auVar172._16_4_ =
         (auVar127._16_4_ * fStack_250 + local_3a0._16_4_ * fVar235) * auVar127._16_4_ +
         fVar235 * fVar180;
    auVar172._20_4_ =
         (auVar127._20_4_ * fStack_24c + local_3a0._20_4_ * fVar178) * auVar127._20_4_ +
         fVar178 * fVar181;
    auVar172._24_4_ =
         (auVar127._24_4_ * fStack_248 + local_3a0._24_4_ * fVar282) * auVar127._24_4_ +
         fVar282 * fVar182;
    auVar172._28_4_ = fStack_1e4 + fVar183 + 1.0;
    auVar196._0_4_ =
         (auVar127._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar231) *
         auVar127._0_4_ + fVar231 * fVar184;
    auVar196._4_4_ =
         (auVar127._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar176) *
         auVar127._4_4_ + fVar176 * fVar204;
    auVar196._8_4_ =
         (auVar127._8_4_ * fStack_278 + fStack_1f8 * fVar233) * auVar127._8_4_ + fVar233 * fVar205;
    auVar196._12_4_ =
         (auVar127._12_4_ * fStack_274 + fStack_1f4 * fVar177) * auVar127._12_4_ + fVar177 * fVar206
    ;
    auVar196._16_4_ =
         (auVar127._16_4_ * fStack_270 + fStack_1f0 * fVar235) * auVar127._16_4_ + fVar235 * fVar207
    ;
    auVar196._20_4_ =
         (auVar127._20_4_ * fStack_26c + fStack_1ec * fVar178) * auVar127._20_4_ + fVar178 * fVar208
    ;
    auVar196._24_4_ =
         (auVar127._24_4_ * fStack_268 + fStack_1e8 * fVar282) * auVar127._24_4_ + fVar282 * fVar209
    ;
    auVar196._28_4_ = fVar329 + 2.0;
    auVar222._0_4_ =
         (auVar127._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar231) *
         auVar127._0_4_ + fVar231 * fVar211;
    auVar222._4_4_ =
         (auVar127._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar176) *
         auVar127._4_4_ + fVar176 * fVar232;
    auVar222._8_4_ =
         (auVar127._8_4_ * fStack_298 + fStack_218 * fVar233) * auVar127._8_4_ + fVar233 * fVar234;
    auVar222._12_4_ =
         (auVar127._12_4_ * fStack_294 + fStack_214 * fVar177) * auVar127._12_4_ + fVar177 * fVar236
    ;
    auVar222._16_4_ =
         (auVar127._16_4_ * fStack_290 + fStack_210 * fVar235) * auVar127._16_4_ + fVar235 * fVar237
    ;
    auVar222._20_4_ =
         (auVar127._20_4_ * fStack_28c + fStack_20c * fVar178) * auVar127._20_4_ + fVar178 * fVar238
    ;
    auVar222._24_4_ =
         (auVar127._24_4_ * fStack_288 + fStack_208 * fVar282) * auVar127._24_4_ + fVar282 * fVar239
    ;
    auVar222._28_4_ = fVar349 + fVar158 + 1.0;
    fVar241 = auVar284._0_4_ * fVar231 + auVar127._0_4_ * auVar91._0_4_;
    fVar256 = auVar284._4_4_ * fVar176 + auVar127._4_4_ * auVar91._4_4_;
    fVar259 = auVar284._8_4_ * fVar233 + auVar127._8_4_ * auVar91._8_4_;
    fVar262 = auVar284._12_4_ * fVar177 + auVar127._12_4_ * auVar91._12_4_;
    fVar265 = auVar284._16_4_ * fVar235 + auVar127._16_4_ * auVar91._16_4_;
    fVar268 = auVar284._20_4_ * fVar178 + auVar127._20_4_ * auVar91._20_4_;
    fVar271 = auVar284._24_4_ * fVar282 + auVar127._24_4_ * auVar91._24_4_;
    fVar273 = fVar349 + fStack_1e4;
    auVar351._0_4_ = auVar296._0_4_ * fVar231 + auVar127._0_4_ * auVar172._0_4_;
    auVar351._4_4_ = auVar296._4_4_ * fVar176 + auVar127._4_4_ * auVar172._4_4_;
    auVar351._8_4_ = auVar296._8_4_ * fVar233 + auVar127._8_4_ * auVar172._8_4_;
    auVar351._12_4_ = auVar296._12_4_ * fVar177 + auVar127._12_4_ * auVar172._12_4_;
    auVar351._16_4_ = auVar296._16_4_ * fVar235 + auVar127._16_4_ * auVar172._16_4_;
    auVar351._20_4_ = auVar296._20_4_ * fVar178 + auVar127._20_4_ * auVar172._20_4_;
    auVar351._24_4_ = auVar296._24_4_ * fVar282 + auVar127._24_4_ * auVar172._24_4_;
    auVar351._28_4_ = fStack_1e4 + fVar329;
    local_2e0._0_4_ = auVar306._0_4_ * fVar231 + auVar127._0_4_ * auVar196._0_4_;
    local_2e0._4_4_ = auVar306._4_4_ * fVar176 + auVar127._4_4_ * auVar196._4_4_;
    local_2e0._8_4_ = auVar306._8_4_ * fVar233 + auVar127._8_4_ * auVar196._8_4_;
    local_2e0._12_4_ = auVar306._12_4_ * fVar177 + auVar127._12_4_ * auVar196._12_4_;
    local_2e0._16_4_ = auVar306._16_4_ * fVar235 + auVar127._16_4_ * auVar196._16_4_;
    local_2e0._20_4_ = auVar306._20_4_ * fVar178 + auVar127._20_4_ * auVar196._20_4_;
    local_2e0._24_4_ = auVar306._24_4_ * fVar282 + auVar127._24_4_ * auVar196._24_4_;
    local_2e0._28_4_ = fVar329 + fStack_1e4;
    local_ac0._0_4_ = auVar75._0_4_;
    auVar249._0_4_ = fVar231 * auVar278._0_4_ + auVar127._0_4_ * auVar222._0_4_;
    auVar249._4_4_ = fVar176 * auVar278._4_4_ + auVar127._4_4_ * auVar222._4_4_;
    auVar249._8_4_ = fVar233 * auVar278._8_4_ + auVar127._8_4_ * auVar222._8_4_;
    auVar249._12_4_ = fVar177 * auVar278._12_4_ + auVar127._12_4_ * auVar222._12_4_;
    auVar249._16_4_ = fVar235 * auVar278._16_4_ + auVar127._16_4_ * auVar222._16_4_;
    auVar249._20_4_ = fVar178 * auVar278._20_4_ + auVar127._20_4_ * auVar222._20_4_;
    auVar249._24_4_ = fVar282 * auVar278._24_4_ + auVar127._24_4_ * auVar222._24_4_;
    auVar249._28_4_ = auVar89._28_4_ + auVar127._28_4_;
    auVar89 = vsubps_avx(auVar91,auVar284);
    auVar197 = vsubps_avx(auVar172,auVar296);
    auVar248 = vsubps_avx(auVar196,auVar306);
    auVar90 = vsubps_avx(auVar222,auVar278);
    auVar163 = vshufps_avx(ZEXT416((uint)((float)local_ac0._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_ac0._0_4_ * 0.04761905)),0);
    fVar204 = auVar163._0_4_;
    fVar318 = fVar204 * auVar89._0_4_ * 3.0;
    fVar205 = auVar163._4_4_;
    fVar323 = fVar205 * auVar89._4_4_ * 3.0;
    auVar19._4_4_ = fVar323;
    auVar19._0_4_ = fVar318;
    fVar211 = auVar163._8_4_;
    fVar324 = fVar211 * auVar89._8_4_ * 3.0;
    auVar19._8_4_ = fVar324;
    fVar180 = auVar163._12_4_;
    fVar325 = fVar180 * auVar89._12_4_ * 3.0;
    auVar19._12_4_ = fVar325;
    fVar326 = fVar204 * auVar89._16_4_ * 3.0;
    auVar19._16_4_ = fVar326;
    fVar327 = fVar205 * auVar89._20_4_ * 3.0;
    auVar19._20_4_ = fVar327;
    fVar328 = fVar211 * auVar89._24_4_ * 3.0;
    auVar19._24_4_ = fVar328;
    auVar19._28_4_ = fVar329;
    fVar305 = fVar204 * auVar197._0_4_ * 3.0;
    fVar312 = fVar205 * auVar197._4_4_ * 3.0;
    local_940._4_4_ = fVar312;
    local_940._0_4_ = fVar305;
    fVar313 = fVar211 * auVar197._8_4_ * 3.0;
    local_940._8_4_ = fVar313;
    fVar314 = fVar180 * auVar197._12_4_ * 3.0;
    local_940._12_4_ = fVar314;
    fVar315 = fVar204 * auVar197._16_4_ * 3.0;
    local_940._16_4_ = fVar315;
    fVar316 = fVar205 * auVar197._20_4_ * 3.0;
    local_940._20_4_ = fVar316;
    fVar317 = fVar211 * auVar197._24_4_ * 3.0;
    local_940._24_4_ = fVar317;
    local_940._28_4_ = auVar306._28_4_;
    fVar330 = fVar204 * auVar248._0_4_ * 3.0;
    fVar337 = fVar205 * auVar248._4_4_ * 3.0;
    auVar20._4_4_ = fVar337;
    auVar20._0_4_ = fVar330;
    fVar339 = fVar211 * auVar248._8_4_ * 3.0;
    auVar20._8_4_ = fVar339;
    fVar341 = fVar180 * auVar248._12_4_ * 3.0;
    auVar20._12_4_ = fVar341;
    fVar343 = fVar204 * auVar248._16_4_ * 3.0;
    auVar20._16_4_ = fVar343;
    fVar345 = fVar205 * auVar248._20_4_ * 3.0;
    auVar20._20_4_ = fVar345;
    fVar347 = fVar211 * auVar248._24_4_ * 3.0;
    auVar20._24_4_ = fVar347;
    auVar20._28_4_ = fVar349;
    fVar235 = fVar204 * auVar90._0_4_ * 3.0;
    fVar178 = fVar205 * auVar90._4_4_ * 3.0;
    auVar15._4_4_ = fVar178;
    auVar15._0_4_ = fVar235;
    fVar179 = fVar211 * auVar90._8_4_ * 3.0;
    auVar15._8_4_ = fVar179;
    fVar180 = fVar180 * auVar90._12_4_ * 3.0;
    auVar15._12_4_ = fVar180;
    fVar204 = fVar204 * auVar90._16_4_ * 3.0;
    auVar15._16_4_ = fVar204;
    fVar205 = fVar205 * auVar90._20_4_ * 3.0;
    auVar15._20_4_ = fVar205;
    fVar211 = fVar211 * auVar90._24_4_ * 3.0;
    auVar15._24_4_ = fVar211;
    auVar15._28_4_ = auVar197._28_4_;
    auVar89 = vperm2f128_avx(auVar351,auVar351,1);
    auVar89 = vshufps_avx(auVar89,auVar351,0x30);
    auVar310 = vshufps_avx(auVar351,auVar89,0x29);
    auVar89 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar89 = vshufps_avx(auVar89,local_2e0,0x30);
    auVar91 = vshufps_avx(local_2e0,auVar89,0x29);
    auVar248 = vsubps_avx(auVar249,auVar15);
    auVar89 = vperm2f128_avx(auVar248,auVar248,1);
    auVar89 = vshufps_avx(auVar89,auVar248,0x30);
    auVar15 = vshufps_avx(auVar248,auVar89,0x29);
    local_500 = vsubps_avx(auVar310,auVar351);
    local_300 = vsubps_avx(auVar91,local_2e0);
    fVar231 = local_500._0_4_;
    fVar282 = local_500._4_4_;
    auVar16._4_4_ = fVar337 * fVar282;
    auVar16._0_4_ = fVar330 * fVar231;
    fVar181 = local_500._8_4_;
    auVar16._8_4_ = fVar339 * fVar181;
    fVar206 = local_500._12_4_;
    auVar16._12_4_ = fVar341 * fVar206;
    fVar234 = local_500._16_4_;
    auVar16._16_4_ = fVar343 * fVar234;
    fVar255 = local_500._20_4_;
    auVar16._20_4_ = fVar345 * fVar255;
    fVar8 = local_500._24_4_;
    auVar16._24_4_ = fVar347 * fVar8;
    auVar16._28_4_ = auVar248._28_4_;
    fVar176 = local_300._0_4_;
    fVar287 = local_300._4_4_;
    auVar17._4_4_ = fVar312 * fVar287;
    auVar17._0_4_ = fVar305 * fVar176;
    fVar182 = local_300._8_4_;
    auVar17._8_4_ = fVar313 * fVar182;
    fVar207 = local_300._12_4_;
    auVar17._12_4_ = fVar314 * fVar207;
    fVar236 = local_300._16_4_;
    auVar17._16_4_ = fVar315 * fVar236;
    fVar258 = local_300._20_4_;
    auVar17._20_4_ = fVar316 * fVar258;
    fVar9 = local_300._24_4_;
    auVar17._24_4_ = fVar317 * fVar9;
    auVar17._28_4_ = auVar89._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar16);
    auVar59._4_4_ = fVar256;
    auVar59._0_4_ = fVar241;
    auVar59._8_4_ = fVar259;
    auVar59._12_4_ = fVar262;
    auVar59._16_4_ = fVar265;
    auVar59._20_4_ = fVar268;
    auVar59._24_4_ = fVar271;
    auVar59._28_4_ = fVar273;
    auVar89 = vperm2f128_avx(auVar59,auVar59,1);
    auVar89 = vshufps_avx(auVar89,auVar59,0x30);
    auVar16 = vshufps_avx(auVar59,auVar89,0x29);
    local_520 = vsubps_avx(auVar16,auVar59);
    auVar336._4_4_ = fVar323 * fVar287;
    auVar336._0_4_ = fVar318 * fVar176;
    auVar336._8_4_ = fVar324 * fVar182;
    auVar336._12_4_ = fVar325 * fVar207;
    auVar336._16_4_ = fVar326 * fVar236;
    auVar336._20_4_ = fVar327 * fVar258;
    auVar336._24_4_ = fVar328 * fVar9;
    auVar336._28_4_ = auVar16._28_4_;
    fVar233 = local_520._0_4_;
    fVar288 = local_520._4_4_;
    auVar198._4_4_ = fVar337 * fVar288;
    auVar198._0_4_ = fVar330 * fVar233;
    fVar183 = local_520._8_4_;
    auVar198._8_4_ = fVar339 * fVar183;
    fVar208 = local_520._12_4_;
    auVar198._12_4_ = fVar341 * fVar208;
    fVar237 = local_520._16_4_;
    auVar198._16_4_ = fVar343 * fVar237;
    fVar261 = local_520._20_4_;
    auVar198._20_4_ = fVar345 * fVar261;
    fVar10 = local_520._24_4_;
    auVar198._24_4_ = fVar347 * fVar10;
    auVar198._28_4_ = auVar284._28_4_;
    auVar336 = vsubps_avx(auVar198,auVar336);
    auVar18._4_4_ = fVar312 * fVar288;
    auVar18._0_4_ = fVar305 * fVar233;
    auVar18._8_4_ = fVar313 * fVar183;
    auVar18._12_4_ = fVar314 * fVar208;
    auVar18._16_4_ = fVar315 * fVar237;
    auVar18._20_4_ = fVar316 * fVar261;
    auVar18._24_4_ = fVar317 * fVar10;
    auVar18._28_4_ = auVar284._28_4_;
    auVar21._4_4_ = fVar323 * fVar282;
    auVar21._0_4_ = fVar318 * fVar231;
    auVar21._8_4_ = fVar324 * fVar181;
    auVar21._12_4_ = fVar325 * fVar206;
    auVar21._16_4_ = fVar326 * fVar234;
    auVar21._20_4_ = fVar327 * fVar255;
    auVar21._24_4_ = fVar328 * fVar8;
    auVar21._28_4_ = auVar296._28_4_;
    auVar198 = vsubps_avx(auVar21,auVar18);
    fVar158 = auVar198._28_4_;
    auVar173._0_4_ = fVar233 * fVar233 + fVar231 * fVar231 + fVar176 * fVar176;
    auVar173._4_4_ = fVar288 * fVar288 + fVar282 * fVar282 + fVar287 * fVar287;
    auVar173._8_4_ = fVar183 * fVar183 + fVar181 * fVar181 + fVar182 * fVar182;
    auVar173._12_4_ = fVar208 * fVar208 + fVar206 * fVar206 + fVar207 * fVar207;
    auVar173._16_4_ = fVar237 * fVar237 + fVar234 * fVar234 + fVar236 * fVar236;
    auVar173._20_4_ = fVar261 * fVar261 + fVar255 * fVar255 + fVar258 * fVar258;
    auVar173._24_4_ = fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9;
    auVar173._28_4_ = fVar158 + fVar158 + auVar17._28_4_;
    auVar89 = vrcpps_avx(auVar173);
    fVar232 = auVar89._0_4_;
    fVar239 = auVar89._4_4_;
    auVar22._4_4_ = fVar239 * auVar173._4_4_;
    auVar22._0_4_ = fVar232 * auVar173._0_4_;
    fVar240 = auVar89._8_4_;
    auVar22._8_4_ = fVar240 * auVar173._8_4_;
    fVar267 = auVar89._12_4_;
    auVar22._12_4_ = fVar267 * auVar173._12_4_;
    fVar270 = auVar89._16_4_;
    auVar22._16_4_ = fVar270 * auVar173._16_4_;
    fVar290 = auVar89._20_4_;
    auVar22._20_4_ = fVar290 * auVar173._20_4_;
    fVar291 = auVar89._24_4_;
    auVar22._24_4_ = fVar291 * auVar173._24_4_;
    auVar22._28_4_ = auVar296._28_4_;
    auVar92._8_4_ = 0x3f800000;
    auVar92._0_8_ = 0x3f8000003f800000;
    auVar92._12_4_ = 0x3f800000;
    auVar92._16_4_ = 0x3f800000;
    auVar92._20_4_ = 0x3f800000;
    auVar92._24_4_ = 0x3f800000;
    auVar92._28_4_ = 0x3f800000;
    auVar18 = vsubps_avx(auVar92,auVar22);
    fVar232 = fVar232 + fVar232 * auVar18._0_4_;
    fVar239 = fVar239 + fVar239 * auVar18._4_4_;
    fVar240 = fVar240 + fVar240 * auVar18._8_4_;
    fVar267 = fVar267 + fVar267 * auVar18._12_4_;
    fVar270 = fVar270 + fVar270 * auVar18._16_4_;
    fVar290 = fVar290 + fVar290 * auVar18._20_4_;
    fVar291 = fVar291 + fVar291 * auVar18._24_4_;
    auVar248 = vperm2f128_avx(local_940,local_940,1);
    auVar248 = vshufps_avx(auVar248,local_940,0x30);
    auVar248 = vshufps_avx(local_940,auVar248,0x29);
    auVar90 = vperm2f128_avx(auVar20,auVar20,1);
    auVar90 = vshufps_avx(auVar90,auVar20,0x30);
    local_8e0 = vshufps_avx(auVar20,auVar90,0x29);
    fVar74 = local_8e0._0_4_;
    fVar102 = local_8e0._4_4_;
    auVar23._4_4_ = fVar102 * fVar282;
    auVar23._0_4_ = fVar74 * fVar231;
    fVar104 = local_8e0._8_4_;
    auVar23._8_4_ = fVar104 * fVar181;
    fVar106 = local_8e0._12_4_;
    auVar23._12_4_ = fVar106 * fVar206;
    fVar107 = local_8e0._16_4_;
    auVar23._16_4_ = fVar107 * fVar234;
    fVar108 = local_8e0._20_4_;
    auVar23._20_4_ = fVar108 * fVar255;
    fVar109 = local_8e0._24_4_;
    auVar23._24_4_ = fVar109 * fVar8;
    auVar23._28_4_ = auVar90._28_4_;
    fVar177 = auVar248._0_4_;
    fVar289 = auVar248._4_4_;
    auVar24._4_4_ = fVar287 * fVar289;
    auVar24._0_4_ = fVar176 * fVar177;
    fVar184 = auVar248._8_4_;
    auVar24._8_4_ = fVar182 * fVar184;
    fVar209 = auVar248._12_4_;
    auVar24._12_4_ = fVar207 * fVar209;
    fVar238 = auVar248._16_4_;
    auVar24._16_4_ = fVar236 * fVar238;
    fVar264 = auVar248._20_4_;
    auVar24._20_4_ = fVar258 * fVar264;
    fVar11 = auVar248._24_4_;
    auVar24._24_4_ = fVar9 * fVar11;
    auVar24._28_4_ = auVar306._28_4_;
    auVar90 = vsubps_avx(auVar24,auVar23);
    auVar248 = vperm2f128_avx(auVar19,auVar19,1);
    auVar248 = vshufps_avx(auVar248,auVar19,0x30);
    local_a80 = vshufps_avx(auVar19,auVar248,0x29);
    fVar331 = local_a80._0_4_;
    fVar338 = local_a80._4_4_;
    auVar25._4_4_ = fVar338 * fVar287;
    auVar25._0_4_ = fVar331 * fVar176;
    fVar340 = local_a80._8_4_;
    auVar25._8_4_ = fVar340 * fVar182;
    fVar342 = local_a80._12_4_;
    auVar25._12_4_ = fVar342 * fVar207;
    fVar344 = local_a80._16_4_;
    auVar25._16_4_ = fVar344 * fVar236;
    fVar346 = local_a80._20_4_;
    auVar25._20_4_ = fVar346 * fVar258;
    fVar348 = local_a80._24_4_;
    auVar25._24_4_ = fVar348 * fVar9;
    auVar25._28_4_ = auVar248._28_4_;
    auVar26._4_4_ = fVar288 * fVar102;
    auVar26._0_4_ = fVar233 * fVar74;
    auVar26._8_4_ = fVar183 * fVar104;
    auVar26._12_4_ = fVar208 * fVar106;
    auVar26._16_4_ = fVar237 * fVar107;
    auVar26._20_4_ = fVar261 * fVar108;
    auVar26._24_4_ = fVar10 * fVar109;
    auVar26._28_4_ = fVar329;
    auVar248 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar288 * fVar289;
    auVar27._0_4_ = fVar233 * fVar177;
    auVar27._8_4_ = fVar183 * fVar184;
    auVar27._12_4_ = fVar208 * fVar209;
    auVar27._16_4_ = fVar237 * fVar238;
    auVar27._20_4_ = fVar261 * fVar264;
    auVar27._24_4_ = fVar10 * fVar11;
    auVar27._28_4_ = fVar329;
    auVar28._4_4_ = fVar338 * fVar282;
    auVar28._0_4_ = fVar331 * fVar231;
    auVar28._8_4_ = fVar340 * fVar181;
    auVar28._12_4_ = fVar342 * fVar206;
    auVar28._16_4_ = fVar344 * fVar234;
    auVar28._20_4_ = fVar346 * fVar255;
    fVar329 = local_a80._28_4_;
    auVar28._24_4_ = fVar348 * fVar8;
    auVar28._28_4_ = fVar329;
    auVar19 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ =
         fVar239 * (auVar17._4_4_ * auVar17._4_4_ +
                   auVar198._4_4_ * auVar198._4_4_ + auVar336._4_4_ * auVar336._4_4_);
    auVar29._0_4_ =
         fVar232 * (auVar17._0_4_ * auVar17._0_4_ +
                   auVar198._0_4_ * auVar198._0_4_ + auVar336._0_4_ * auVar336._0_4_);
    auVar29._8_4_ =
         fVar240 * (auVar17._8_4_ * auVar17._8_4_ +
                   auVar198._8_4_ * auVar198._8_4_ + auVar336._8_4_ * auVar336._8_4_);
    auVar29._12_4_ =
         fVar267 * (auVar17._12_4_ * auVar17._12_4_ +
                   auVar198._12_4_ * auVar198._12_4_ + auVar336._12_4_ * auVar336._12_4_);
    auVar29._16_4_ =
         fVar270 * (auVar17._16_4_ * auVar17._16_4_ +
                   auVar198._16_4_ * auVar198._16_4_ + auVar336._16_4_ * auVar336._16_4_);
    auVar29._20_4_ =
         fVar290 * (auVar17._20_4_ * auVar17._20_4_ +
                   auVar198._20_4_ * auVar198._20_4_ + auVar336._20_4_ * auVar336._20_4_);
    auVar29._24_4_ =
         fVar291 * (auVar17._24_4_ * auVar17._24_4_ +
                   auVar198._24_4_ * auVar198._24_4_ + auVar336._24_4_ * auVar336._24_4_);
    auVar29._28_4_ = auVar17._28_4_ + fVar158 + auVar336._28_4_;
    auVar30._4_4_ =
         (auVar90._4_4_ * auVar90._4_4_ +
         auVar248._4_4_ * auVar248._4_4_ + auVar19._4_4_ * auVar19._4_4_) * fVar239;
    auVar30._0_4_ =
         (auVar90._0_4_ * auVar90._0_4_ +
         auVar248._0_4_ * auVar248._0_4_ + auVar19._0_4_ * auVar19._0_4_) * fVar232;
    auVar30._8_4_ =
         (auVar90._8_4_ * auVar90._8_4_ +
         auVar248._8_4_ * auVar248._8_4_ + auVar19._8_4_ * auVar19._8_4_) * fVar240;
    auVar30._12_4_ =
         (auVar90._12_4_ * auVar90._12_4_ +
         auVar248._12_4_ * auVar248._12_4_ + auVar19._12_4_ * auVar19._12_4_) * fVar267;
    auVar30._16_4_ =
         (auVar90._16_4_ * auVar90._16_4_ +
         auVar248._16_4_ * auVar248._16_4_ + auVar19._16_4_ * auVar19._16_4_) * fVar270;
    auVar30._20_4_ =
         (auVar90._20_4_ * auVar90._20_4_ +
         auVar248._20_4_ * auVar248._20_4_ + auVar19._20_4_ * auVar19._20_4_) * fVar290;
    auVar30._24_4_ =
         (auVar90._24_4_ * auVar90._24_4_ +
         auVar248._24_4_ * auVar248._24_4_ + auVar19._24_4_ * auVar19._24_4_) * fVar291;
    auVar30._28_4_ = auVar89._28_4_ + auVar18._28_4_;
    auVar89 = vmaxps_avx(auVar29,auVar30);
    auVar248 = vperm2f128_avx(auVar249,auVar249,1);
    auVar248 = vshufps_avx(auVar248,auVar249,0x30);
    local_600 = vshufps_avx(auVar249,auVar248,0x29);
    local_620._0_4_ = auVar249._0_4_ + fVar235;
    local_620._4_4_ = auVar249._4_4_ + fVar178;
    local_620._8_4_ = auVar249._8_4_ + fVar179;
    local_620._12_4_ = auVar249._12_4_ + fVar180;
    local_620._16_4_ = auVar249._16_4_ + fVar204;
    local_620._20_4_ = auVar249._20_4_ + fVar205;
    local_620._24_4_ = auVar249._24_4_ + fVar211;
    local_620._28_4_ = auVar249._28_4_ + auVar197._28_4_;
    auVar248 = vmaxps_avx(auVar249,local_620);
    auVar90 = vmaxps_avx(auVar15,local_600);
    auVar248 = vmaxps_avx(auVar248,auVar90);
    auVar90 = vrsqrtps_avx(auVar173);
    fVar158 = auVar90._0_4_;
    fVar235 = auVar90._4_4_;
    fVar178 = auVar90._8_4_;
    fVar179 = auVar90._12_4_;
    fVar180 = auVar90._16_4_;
    fVar204 = auVar90._20_4_;
    fVar205 = auVar90._24_4_;
    local_5a0 = fVar158 * 1.5 + fVar158 * fVar158 * fVar158 * auVar173._0_4_ * -0.5;
    fStack_59c = fVar235 * 1.5 + fVar235 * fVar235 * fVar235 * auVar173._4_4_ * -0.5;
    fStack_598 = fVar178 * 1.5 + fVar178 * fVar178 * fVar178 * auVar173._8_4_ * -0.5;
    fStack_594 = fVar179 * 1.5 + fVar179 * fVar179 * fVar179 * auVar173._12_4_ * -0.5;
    fStack_590 = fVar180 * 1.5 + fVar180 * fVar180 * fVar180 * auVar173._16_4_ * -0.5;
    fStack_58c = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar173._20_4_ * -0.5;
    fStack_588 = fVar205 * 1.5 + fVar205 * fVar205 * fVar205 * auVar173._24_4_ * -0.5;
    auVar197 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a00 = vsubps_avx(auVar197,auVar351);
    auVar197 = vsubps_avx(auVar197,local_2e0);
    fVar295 = auVar197._0_4_;
    fVar299 = auVar197._4_4_;
    fVar300 = auVar197._8_4_;
    fVar301 = auVar197._12_4_;
    fVar302 = auVar197._16_4_;
    fVar303 = auVar197._20_4_;
    fVar304 = auVar197._24_4_;
    fVar235 = local_a00._0_4_;
    fVar179 = local_a00._4_4_;
    fVar204 = local_a00._8_4_;
    fVar211 = local_a00._12_4_;
    fVar239 = local_a00._16_4_;
    fVar267 = local_a00._20_4_;
    fVar290 = local_a00._24_4_;
    auVar60._4_4_ = fVar256;
    auVar60._0_4_ = fVar241;
    auVar60._8_4_ = fVar259;
    auVar60._12_4_ = fVar262;
    auVar60._16_4_ = fVar265;
    auVar60._20_4_ = fVar268;
    auVar60._24_4_ = fVar271;
    auVar60._28_4_ = fVar273;
    auVar198 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar197 = vsubps_avx(auVar198,auVar60);
    fVar178 = auVar197._0_4_;
    fVar180 = auVar197._4_4_;
    fVar205 = auVar197._8_4_;
    fVar232 = auVar197._12_4_;
    fVar240 = auVar197._16_4_;
    fVar270 = auVar197._20_4_;
    fVar291 = auVar197._24_4_;
    auVar321._0_4_ =
         (float)local_a20._0_4_ * fVar178 +
         (float)local_6a0._0_4_ * fVar235 + fVar295 * (float)local_840._0_4_;
    auVar321._4_4_ =
         (float)local_a20._4_4_ * fVar180 +
         (float)local_6a0._4_4_ * fVar179 + fVar299 * (float)local_840._4_4_;
    auVar321._8_4_ = fStack_a18 * fVar205 + fStack_698 * fVar204 + fVar300 * fStack_838;
    auVar321._12_4_ = fStack_a14 * fVar232 + fStack_694 * fVar211 + fVar301 * fStack_834;
    auVar321._16_4_ = fStack_a10 * fVar240 + fStack_690 * fVar239 + fVar302 * fStack_830;
    auVar321._20_4_ = fStack_a0c * fVar270 + fStack_68c * fVar267 + fVar303 * fStack_82c;
    auVar321._24_4_ = fStack_a08 * fVar291 + fStack_688 * fVar290 + fVar304 * fStack_828;
    auVar321._28_4_ = fVar329 + auVar19._28_4_ + auVar173._28_4_;
    auVar334._0_4_ = fVar178 * fVar178 + fVar235 * fVar235 + fVar295 * fVar295;
    auVar334._4_4_ = fVar180 * fVar180 + fVar179 * fVar179 + fVar299 * fVar299;
    auVar334._8_4_ = fVar205 * fVar205 + fVar204 * fVar204 + fVar300 * fVar300;
    auVar334._12_4_ = fVar232 * fVar232 + fVar211 * fVar211 + fVar301 * fVar301;
    auVar334._16_4_ = fVar240 * fVar240 + fVar239 * fVar239 + fVar302 * fVar302;
    auVar334._20_4_ = fVar270 * fVar270 + fVar267 * fVar267 + fVar303 * fVar303;
    auVar334._24_4_ = fVar291 * fVar291 + fVar290 * fVar290 + fVar304 * fVar304;
    auVar334._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar329;
    local_540 = (float)local_a20._0_4_ * fVar233 * local_5a0 +
                local_5a0 * fVar231 * (float)local_6a0._0_4_ +
                fVar176 * local_5a0 * (float)local_840._0_4_;
    fStack_53c = (float)local_a20._4_4_ * fVar288 * fStack_59c +
                 fStack_59c * fVar282 * (float)local_6a0._4_4_ +
                 fVar287 * fStack_59c * (float)local_840._4_4_;
    fStack_538 = fStack_a18 * fVar183 * fStack_598 +
                 fStack_598 * fVar181 * fStack_698 + fVar182 * fStack_598 * fStack_838;
    fStack_534 = fStack_a14 * fVar208 * fStack_594 +
                 fStack_594 * fVar206 * fStack_694 + fVar207 * fStack_594 * fStack_834;
    fStack_530 = fStack_a10 * fVar237 * fStack_590 +
                 fStack_590 * fVar234 * fStack_690 + fVar236 * fStack_590 * fStack_830;
    fStack_52c = fStack_a0c * fVar261 * fStack_58c +
                 fStack_58c * fVar255 * fStack_68c + fVar258 * fStack_58c * fStack_82c;
    fStack_528 = fStack_a08 * fVar10 * fStack_588 +
                 fStack_588 * fVar8 * fStack_688 + fVar9 * fStack_588 * fStack_828;
    fVar158 = fStack_a04 + fStack_684 + fStack_824;
    local_5c0 = fVar178 * fVar233 * local_5a0 +
                local_5a0 * fVar231 * fVar235 + fVar295 * fVar176 * local_5a0;
    fStack_5bc = fVar180 * fVar288 * fStack_59c +
                 fStack_59c * fVar282 * fVar179 + fVar299 * fVar287 * fStack_59c;
    fStack_5b8 = fVar205 * fVar183 * fStack_598 +
                 fStack_598 * fVar181 * fVar204 + fVar300 * fVar182 * fStack_598;
    fStack_5b4 = fVar232 * fVar208 * fStack_594 +
                 fStack_594 * fVar206 * fVar211 + fVar301 * fVar207 * fStack_594;
    fStack_5b0 = fVar240 * fVar237 * fStack_590 +
                 fStack_590 * fVar234 * fVar239 + fVar302 * fVar236 * fStack_590;
    fStack_5ac = fVar270 * fVar261 * fStack_58c +
                 fStack_58c * fVar255 * fVar267 + fVar303 * fVar258 * fStack_58c;
    fStack_5a8 = fVar291 * fVar10 * fStack_588 +
                 fStack_588 * fVar8 * fVar290 + fVar304 * fVar9 * fStack_588;
    fStack_5a4 = fStack_684 + fVar158;
    auVar197._4_4_ = fStack_53c * fStack_5bc;
    auVar197._0_4_ = local_540 * local_5c0;
    auVar197._8_4_ = fStack_538 * fStack_5b8;
    auVar197._12_4_ = fStack_534 * fStack_5b4;
    auVar197._16_4_ = fStack_530 * fStack_5b0;
    auVar197._20_4_ = fStack_52c * fStack_5ac;
    auVar197._24_4_ = fStack_528 * fStack_5a8;
    auVar197._28_4_ = fVar158;
    auVar197 = vsubps_avx(auVar321,auVar197);
    auVar31._4_4_ = fStack_5bc * fStack_5bc;
    auVar31._0_4_ = local_5c0 * local_5c0;
    auVar31._8_4_ = fStack_5b8 * fStack_5b8;
    auVar31._12_4_ = fStack_5b4 * fStack_5b4;
    auVar31._16_4_ = fStack_5b0 * fStack_5b0;
    auVar31._20_4_ = fStack_5ac * fStack_5ac;
    auVar31._24_4_ = fStack_5a8 * fStack_5a8;
    auVar31._28_4_ = fStack_684;
    auVar17 = vsubps_avx(auVar334,auVar31);
    local_680 = vsqrtps_avx(auVar89);
    fVar158 = (local_680._0_4_ + auVar248._0_4_) * 1.0000002;
    fVar329 = (local_680._4_4_ + auVar248._4_4_) * 1.0000002;
    fVar153 = (local_680._8_4_ + auVar248._8_4_) * 1.0000002;
    fVar154 = (local_680._12_4_ + auVar248._12_4_) * 1.0000002;
    fVar155 = (local_680._16_4_ + auVar248._16_4_) * 1.0000002;
    fVar156 = (local_680._20_4_ + auVar248._20_4_) * 1.0000002;
    fVar157 = (local_680._24_4_ + auVar248._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar329 * fVar329;
    auVar32._0_4_ = fVar158 * fVar158;
    auVar32._8_4_ = fVar153 * fVar153;
    auVar32._12_4_ = fVar154 * fVar154;
    auVar32._16_4_ = fVar155 * fVar155;
    auVar32._20_4_ = fVar156 * fVar156;
    auVar32._24_4_ = fVar157 * fVar157;
    auVar32._28_4_ = local_680._28_4_ + auVar248._28_4_;
    local_9a0._0_4_ = auVar197._0_4_ + auVar197._0_4_;
    local_9a0._4_4_ = auVar197._4_4_ + auVar197._4_4_;
    local_9a0._8_4_ = auVar197._8_4_ + auVar197._8_4_;
    local_9a0._12_4_ = auVar197._12_4_ + auVar197._12_4_;
    local_9a0._16_4_ = auVar197._16_4_ + auVar197._16_4_;
    local_9a0._20_4_ = auVar197._20_4_ + auVar197._20_4_;
    local_9a0._24_4_ = auVar197._24_4_ + auVar197._24_4_;
    fVar158 = auVar197._28_4_;
    local_9a0._28_4_ = fVar158 + fVar158;
    auVar248 = vsubps_avx(auVar17,auVar32);
    auVar33._4_4_ = fStack_53c * fStack_53c;
    auVar33._0_4_ = local_540 * local_540;
    auVar33._8_4_ = fStack_538 * fStack_538;
    auVar33._12_4_ = fStack_534 * fStack_534;
    auVar33._16_4_ = fStack_530 * fStack_530;
    auVar33._20_4_ = fStack_52c * fStack_52c;
    auVar33._24_4_ = fStack_528 * fStack_528;
    auVar33._28_4_ = fVar158;
    auVar197 = vsubps_avx(local_2c0,auVar33);
    local_640._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
    local_640._0_4_ = (float)local_9a0._0_4_ * (float)local_9a0._0_4_;
    local_640._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
    local_640._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
    local_640._16_4_ = local_9a0._16_4_ * local_9a0._16_4_;
    local_640._20_4_ = local_9a0._20_4_ * local_9a0._20_4_;
    local_640._24_4_ = local_9a0._24_4_ * local_9a0._24_4_;
    local_640._28_4_ = local_2c0._28_4_;
    fVar158 = auVar197._0_4_;
    local_660._0_4_ = fVar158 * 4.0;
    fVar329 = auVar197._4_4_;
    local_660._4_4_ = fVar329 * 4.0;
    fVar153 = auVar197._8_4_;
    fStack_658 = fVar153 * 4.0;
    fVar154 = auVar197._12_4_;
    fStack_654 = fVar154 * 4.0;
    fVar155 = auVar197._16_4_;
    fStack_650 = fVar155 * 4.0;
    fVar156 = auVar197._20_4_;
    fStack_64c = fVar156 * 4.0;
    fVar157 = auVar197._24_4_;
    fStack_648 = fVar157 * 4.0;
    uStack_644 = 0x40800000;
    auVar34._4_4_ = auVar248._4_4_ * (float)local_660._4_4_;
    auVar34._0_4_ = auVar248._0_4_ * (float)local_660._0_4_;
    auVar34._8_4_ = auVar248._8_4_ * fStack_658;
    auVar34._12_4_ = auVar248._12_4_ * fStack_654;
    auVar34._16_4_ = auVar248._16_4_ * fStack_650;
    auVar34._20_4_ = auVar248._20_4_ * fStack_64c;
    auVar34._24_4_ = auVar248._24_4_ * fStack_648;
    auVar34._28_4_ = 0x40800000;
    auVar336 = vsubps_avx(local_640,auVar34);
    auVar89 = vcmpps_avx(auVar336,auVar198,5);
    auVar298 = ZEXT3264(auVar89);
    auVar93._8_4_ = 0x7fffffff;
    auVar93._0_8_ = 0x7fffffff7fffffff;
    auVar93._12_4_ = 0x7fffffff;
    auVar93._16_4_ = 0x7fffffff;
    auVar93._20_4_ = 0x7fffffff;
    auVar93._24_4_ = 0x7fffffff;
    auVar93._28_4_ = 0x7fffffff;
    local_420 = vandps_avx(auVar33,auVar93);
    local_340._0_4_ = fVar158 + fVar158;
    local_340._4_4_ = fVar329 + fVar329;
    local_340._8_4_ = fVar153 + fVar153;
    local_340._12_4_ = fVar154 + fVar154;
    local_340._16_4_ = fVar155 + fVar155;
    local_340._20_4_ = fVar156 + fVar156;
    local_340._24_4_ = fVar157 + fVar157;
    local_340._28_4_ = auVar197._28_4_ + auVar197._28_4_;
    local_980 = vandps_avx(auVar197,auVar93);
    uVar67 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
    local_320._0_8_ = uVar67 ^ 0x8000000080000000;
    local_320._8_4_ = -local_9a0._8_4_;
    local_320._12_4_ = -local_9a0._12_4_;
    local_320._16_4_ = -local_9a0._16_4_;
    local_320._20_4_ = -local_9a0._20_4_;
    local_320._24_4_ = -local_9a0._24_4_;
    local_320._28_4_ = -local_9a0._28_4_;
    fStack_524 = fStack_a04 + fStack_684 + fStack_824;
    if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar89 >> 0x7f,0) == '\0') &&
          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar89 >> 0xbf,0) == '\0') &&
        (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar89[0x1f]) {
      local_900._8_4_ = 0x7f800000;
      local_900._0_8_ = 0x7f8000007f800000;
      local_900._12_4_ = 0x7f800000;
      local_900._16_4_ = 0x7f800000;
      local_900._20_4_ = 0x7f800000;
      local_900._24_4_ = 0x7f800000;
      local_900._28_4_ = 0x7f800000;
      auVar147._8_4_ = 0xff800000;
      auVar147._0_8_ = 0xff800000ff800000;
      auVar147._12_4_ = 0xff800000;
      auVar147._16_4_ = 0xff800000;
      auVar147._20_4_ = 0xff800000;
      auVar147._24_4_ = 0xff800000;
      auVar147._28_4_ = 0xff800000;
    }
    else {
      auVar18 = vsqrtps_avx(auVar336);
      auVar197 = vrcpps_avx(local_340);
      auVar89 = vcmpps_avx(auVar336,auVar198,5);
      fVar158 = auVar197._0_4_;
      fVar329 = auVar197._4_4_;
      auVar35._4_4_ = local_340._4_4_ * fVar329;
      auVar35._0_4_ = local_340._0_4_ * fVar158;
      fVar153 = auVar197._8_4_;
      auVar35._8_4_ = local_340._8_4_ * fVar153;
      fVar154 = auVar197._12_4_;
      auVar35._12_4_ = local_340._12_4_ * fVar154;
      fVar155 = auVar197._16_4_;
      auVar35._16_4_ = local_340._16_4_ * fVar155;
      fVar156 = auVar197._20_4_;
      auVar35._20_4_ = local_340._20_4_ * fVar156;
      fVar157 = auVar197._24_4_;
      auVar35._24_4_ = local_340._24_4_ * fVar157;
      auVar35._28_4_ = auVar336._28_4_;
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar336 = vsubps_avx(auVar94,auVar35);
      fVar158 = fVar158 + fVar158 * auVar336._0_4_;
      fVar329 = fVar329 + fVar329 * auVar336._4_4_;
      fVar153 = fVar153 + fVar153 * auVar336._8_4_;
      fVar154 = fVar154 + fVar154 * auVar336._12_4_;
      fVar155 = fVar155 + fVar155 * auVar336._16_4_;
      fVar156 = fVar156 + fVar156 * auVar336._20_4_;
      fVar157 = fVar157 + fVar157 * auVar336._24_4_;
      auVar198 = vsubps_avx(local_320,auVar18);
      fVar242 = auVar198._0_4_ * fVar158;
      fVar257 = auVar198._4_4_ * fVar329;
      auVar36._4_4_ = fVar257;
      auVar36._0_4_ = fVar242;
      fVar260 = auVar198._8_4_ * fVar153;
      auVar36._8_4_ = fVar260;
      fVar263 = auVar198._12_4_ * fVar154;
      auVar36._12_4_ = fVar263;
      fVar266 = auVar198._16_4_ * fVar155;
      auVar36._16_4_ = fVar266;
      fVar269 = auVar198._20_4_ * fVar156;
      auVar36._20_4_ = fVar269;
      fVar272 = auVar198._24_4_ * fVar157;
      auVar36._24_4_ = fVar272;
      auVar36._28_4_ = auVar198._28_4_;
      auVar198 = vsubps_avx(auVar18,local_9a0);
      fVar158 = auVar198._0_4_ * fVar158;
      fVar329 = auVar198._4_4_ * fVar329;
      auVar37._4_4_ = fVar329;
      auVar37._0_4_ = fVar158;
      fVar153 = auVar198._8_4_ * fVar153;
      auVar37._8_4_ = fVar153;
      fVar154 = auVar198._12_4_ * fVar154;
      auVar37._12_4_ = fVar154;
      fVar155 = auVar198._16_4_ * fVar155;
      auVar37._16_4_ = fVar155;
      fVar156 = auVar198._20_4_ * fVar156;
      auVar37._20_4_ = fVar156;
      fVar157 = auVar198._24_4_ * fVar157;
      auVar37._24_4_ = fVar157;
      auVar37._28_4_ = auVar197._28_4_ + auVar336._28_4_;
      fStack_3e4 = fStack_5a4 + auVar198._28_4_;
      local_400 = local_5a0 * (local_5c0 + local_540 * fVar242);
      fStack_3fc = fStack_59c * (fStack_5bc + fStack_53c * fVar257);
      fStack_3f8 = fStack_598 * (fStack_5b8 + fStack_538 * fVar260);
      fStack_3f4 = fStack_594 * (fStack_5b4 + fStack_534 * fVar263);
      fStack_3f0 = fStack_590 * (fStack_5b0 + fStack_530 * fVar266);
      fStack_3ec = fStack_58c * (fStack_5ac + fStack_52c * fVar269);
      fStack_3e8 = fStack_588 * (fStack_5a8 + fStack_528 * fVar272);
      local_3e0 = local_5a0 * (local_5c0 + local_540 * fVar158);
      fStack_3dc = fStack_59c * (fStack_5bc + fStack_53c * fVar329);
      fStack_3d8 = fStack_598 * (fStack_5b8 + fStack_538 * fVar153);
      fStack_3d4 = fStack_594 * (fStack_5b4 + fStack_534 * fVar154);
      fStack_3d0 = fStack_590 * (fStack_5b0 + fStack_530 * fVar155);
      fStack_3cc = fStack_58c * (fStack_5ac + fStack_52c * fVar156);
      fStack_3c8 = fStack_588 * (fStack_5a8 + fStack_528 * fVar157);
      fStack_3c4 = fStack_5a4 + fStack_3e4;
      auVar223._8_4_ = 0x7f800000;
      auVar223._0_8_ = 0x7f8000007f800000;
      auVar223._12_4_ = 0x7f800000;
      auVar223._16_4_ = 0x7f800000;
      auVar223._20_4_ = 0x7f800000;
      auVar223._24_4_ = 0x7f800000;
      auVar223._28_4_ = 0x7f800000;
      local_900 = vblendvps_avx(auVar223,auVar36,auVar89);
      auVar224._8_4_ = 0xff800000;
      auVar224._0_8_ = 0xff800000ff800000;
      auVar224._12_4_ = 0xff800000;
      auVar224._16_4_ = 0xff800000;
      auVar224._20_4_ = 0xff800000;
      auVar224._24_4_ = 0xff800000;
      auVar224._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar224,auVar37,auVar89);
      auVar197 = vmaxps_avx(local_580,local_420);
      auVar38._4_4_ = auVar197._4_4_ * 1.9073486e-06;
      auVar38._0_4_ = auVar197._0_4_ * 1.9073486e-06;
      auVar38._8_4_ = auVar197._8_4_ * 1.9073486e-06;
      auVar38._12_4_ = auVar197._12_4_ * 1.9073486e-06;
      auVar38._16_4_ = auVar197._16_4_ * 1.9073486e-06;
      auVar38._20_4_ = auVar197._20_4_ * 1.9073486e-06;
      auVar38._24_4_ = auVar197._24_4_ * 1.9073486e-06;
      auVar38._28_4_ = auVar197._28_4_;
      auVar197 = vcmpps_avx(local_980,auVar38,1);
      auVar336 = auVar89 & auVar197;
      if ((((((((auVar336 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar336 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar336 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar336 >> 0x7f,0) != '\0') ||
            (auVar336 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar336 >> 0xbf,0) != '\0') ||
          (auVar336 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar336[0x1f] < '\0') {
        auVar197 = vandps_avx(auVar197,auVar89);
        auVar163 = vpackssdw_avx(auVar197._0_16_,auVar197._16_16_);
        auVar336 = vcmpps_avx(auVar248,_DAT_01f7b000,2);
        auVar294._8_4_ = 0xff800000;
        auVar294._0_8_ = 0xff800000ff800000;
        auVar294._12_4_ = 0xff800000;
        auVar294._16_4_ = 0xff800000;
        auVar294._20_4_ = 0xff800000;
        auVar294._24_4_ = 0xff800000;
        auVar294._28_4_ = 0xff800000;
        auVar322._8_4_ = 0x7f800000;
        auVar322._0_8_ = 0x7f8000007f800000;
        auVar322._12_4_ = 0x7f800000;
        auVar322._16_4_ = 0x7f800000;
        auVar322._20_4_ = 0x7f800000;
        auVar322._24_4_ = 0x7f800000;
        auVar322._28_4_ = 0x7f800000;
        auVar248 = vblendvps_avx(auVar322,auVar294,auVar336);
        auVar76 = vpmovsxwd_avx(auVar163);
        auVar163 = vpunpckhwd_avx(auVar163,auVar163);
        auVar253._16_16_ = auVar163;
        auVar253._0_16_ = auVar76;
        local_900 = vblendvps_avx(local_900,auVar248,auVar253);
        auVar248 = vblendvps_avx(auVar294,auVar322,auVar336);
        auVar147 = vblendvps_avx(auVar147,auVar248,auVar253);
        auVar230._0_8_ = auVar197._0_8_ ^ 0xffffffffffffffff;
        auVar230._8_4_ = auVar197._8_4_ ^ 0xffffffff;
        auVar230._12_4_ = auVar197._12_4_ ^ 0xffffffff;
        auVar230._16_4_ = auVar197._16_4_ ^ 0xffffffff;
        auVar230._20_4_ = auVar197._20_4_ ^ 0xffffffff;
        auVar230._24_4_ = auVar197._24_4_ ^ 0xffffffff;
        auVar230._28_4_ = auVar197._28_4_ ^ 0xffffffff;
        auVar248 = vorps_avx(auVar336,auVar230);
        auVar89 = vandps_avx(auVar89,auVar248);
        auVar298 = ZEXT3264(auVar89);
      }
    }
    auVar353 = ZEXT3264(local_920);
    auVar89 = local_4e0 & auVar298._0_32_;
    auVar254 = ZEXT3264(local_960);
    fVar158 = (float)local_860._0_4_;
    fVar329 = (float)local_860._4_4_;
    fVar153 = fStack_858;
    fVar154 = fStack_854;
    fVar155 = fStack_850;
    fVar156 = fStack_84c;
    fVar157 = fStack_848;
    fVar242 = fStack_844;
    if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar89 >> 0x7f,0) == '\0') &&
          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar89 >> 0xbf,0) == '\0') &&
        (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar89[0x1f]) {
      auVar311 = ZEXT3264(local_aa0);
      auVar298 = ZEXT3264(local_9e0);
    }
    else {
      fStack_584 = auVar90._28_4_ + auVar173._28_4_;
      auVar353 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar163 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_));
      auVar163 = vshufps_avx(auVar163,auVar163,0);
      auVar225._16_16_ = auVar163;
      auVar225._0_16_ = auVar163;
      auVar197 = vminps_avx(auVar225,auVar147);
      auVar95._0_4_ =
           (float)local_a20._0_4_ * fVar318 +
           (float)local_6a0._0_4_ * fVar305 + (float)local_840._0_4_ * fVar330;
      auVar95._4_4_ =
           (float)local_a20._4_4_ * fVar323 +
           (float)local_6a0._4_4_ * fVar312 + (float)local_840._4_4_ * fVar337;
      auVar95._8_4_ = fStack_a18 * fVar324 + fStack_698 * fVar313 + fStack_838 * fVar339;
      auVar95._12_4_ = fStack_a14 * fVar325 + fStack_694 * fVar314 + fStack_834 * fVar341;
      auVar95._16_4_ = fStack_a10 * fVar326 + fStack_690 * fVar315 + fStack_830 * fVar343;
      auVar95._20_4_ = fStack_a0c * fVar327 + fStack_68c * fVar316 + fStack_82c * fVar345;
      auVar95._24_4_ = fStack_a08 * fVar328 + fStack_688 * fVar317 + fStack_828 * fVar347;
      auVar95._28_4_ = fVar349 + auVar306._28_4_ + fVar349;
      auVar90 = vrcpps_avx(auVar95);
      fVar349 = auVar90._0_4_;
      fVar257 = auVar90._4_4_;
      auVar39._4_4_ = auVar95._4_4_ * fVar257;
      auVar39._0_4_ = auVar95._0_4_ * fVar349;
      fVar260 = auVar90._8_4_;
      auVar39._8_4_ = auVar95._8_4_ * fVar260;
      fVar263 = auVar90._12_4_;
      auVar39._12_4_ = auVar95._12_4_ * fVar263;
      fVar266 = auVar90._16_4_;
      auVar39._16_4_ = auVar95._16_4_ * fVar266;
      fVar269 = auVar90._20_4_;
      auVar39._20_4_ = auVar95._20_4_ * fVar269;
      fVar272 = auVar90._24_4_;
      auVar39._24_4_ = auVar95._24_4_ * fVar272;
      auVar39._28_4_ = local_aa0._28_4_ + auVar163._12_4_;
      auVar279._8_4_ = 0x3f800000;
      auVar279._0_8_ = 0x3f8000003f800000;
      auVar279._12_4_ = 0x3f800000;
      auVar279._16_4_ = 0x3f800000;
      auVar279._20_4_ = 0x3f800000;
      auVar279._24_4_ = 0x3f800000;
      auVar279._28_4_ = 0x3f800000;
      auVar336 = vsubps_avx(auVar279,auVar39);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar89 = vandps_avx(auVar95,auVar250);
      auVar335._8_4_ = 0x219392ef;
      auVar335._0_8_ = 0x219392ef219392ef;
      auVar335._12_4_ = 0x219392ef;
      auVar335._16_4_ = 0x219392ef;
      auVar335._20_4_ = 0x219392ef;
      auVar335._24_4_ = 0x219392ef;
      auVar335._28_4_ = 0x219392ef;
      auVar248 = vcmpps_avx(auVar89,auVar335,1);
      auVar40._4_4_ =
           (fVar257 + fVar257 * auVar336._4_4_) *
           -(fVar180 * fVar323 + fVar312 * fVar179 + fVar299 * fVar337);
      auVar40._0_4_ =
           (fVar349 + fVar349 * auVar336._0_4_) *
           -(fVar178 * fVar318 + fVar305 * fVar235 + fVar295 * fVar330);
      auVar40._8_4_ =
           (fVar260 + fVar260 * auVar336._8_4_) *
           -(fVar205 * fVar324 + fVar313 * fVar204 + fVar300 * fVar339);
      auVar40._12_4_ =
           (fVar263 + fVar263 * auVar336._12_4_) *
           -(fVar232 * fVar325 + fVar314 * fVar211 + fVar301 * fVar341);
      auVar40._16_4_ =
           (fVar266 + fVar266 * auVar336._16_4_) *
           -(fVar240 * fVar326 + fVar315 * fVar239 + fVar302 * fVar343);
      auVar40._20_4_ =
           (fVar269 + fVar269 * auVar336._20_4_) *
           -(fVar270 * fVar327 + fVar316 * fVar267 + fVar303 * fVar345);
      auVar40._24_4_ =
           (fVar272 + fVar272 * auVar336._24_4_) *
           -(fVar291 * fVar328 + fVar317 * fVar290 + fVar304 * fVar347);
      auVar40._28_4_ = auVar90._28_4_ + auVar336._28_4_;
      auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar89 = vcmpps_avx(auVar95,auVar90,1);
      auVar89 = vorps_avx(auVar248,auVar89);
      auVar293._8_4_ = 0xff800000;
      auVar293._0_8_ = 0xff800000ff800000;
      auVar293._12_4_ = 0xff800000;
      auVar293._16_4_ = 0xff800000;
      auVar293._20_4_ = 0xff800000;
      auVar293._24_4_ = 0xff800000;
      auVar293._28_4_ = 0xff800000;
      auVar89 = vblendvps_avx(auVar40,auVar293,auVar89);
      auVar90 = vcmpps_avx(auVar95,auVar90,6);
      auVar248 = vorps_avx(auVar248,auVar90);
      auVar297._8_4_ = 0x7f800000;
      auVar297._0_8_ = 0x7f8000007f800000;
      auVar297._12_4_ = 0x7f800000;
      auVar297._16_4_ = 0x7f800000;
      auVar297._20_4_ = 0x7f800000;
      auVar297._24_4_ = 0x7f800000;
      auVar297._28_4_ = 0x7f800000;
      auVar248 = vblendvps_avx(auVar40,auVar297,auVar248);
      auVar90 = vmaxps_avx(local_3c0,local_900);
      auVar90 = vmaxps_avx(auVar90,auVar89);
      auVar197 = vminps_avx(auVar197,auVar248);
      auVar336 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar89 = vsubps_avx(auVar336,auVar310);
      auVar248 = vsubps_avx(auVar336,auVar91);
      auVar41._4_4_ = auVar248._4_4_ * -fVar102;
      auVar41._0_4_ = auVar248._0_4_ * -fVar74;
      auVar41._8_4_ = auVar248._8_4_ * -fVar104;
      auVar41._12_4_ = auVar248._12_4_ * -fVar106;
      auVar41._16_4_ = auVar248._16_4_ * -fVar107;
      auVar41._20_4_ = auVar248._20_4_ * -fVar108;
      auVar41._24_4_ = auVar248._24_4_ * -fVar109;
      auVar41._28_4_ = auVar248._28_4_;
      auVar42._4_4_ = fVar289 * auVar89._4_4_;
      auVar42._0_4_ = fVar177 * auVar89._0_4_;
      auVar42._8_4_ = fVar184 * auVar89._8_4_;
      auVar42._12_4_ = fVar209 * auVar89._12_4_;
      auVar42._16_4_ = fVar238 * auVar89._16_4_;
      auVar42._20_4_ = fVar264 * auVar89._20_4_;
      auVar42._24_4_ = fVar11 * auVar89._24_4_;
      auVar42._28_4_ = auVar89._28_4_;
      auVar89 = vsubps_avx(auVar41,auVar42);
      auVar248 = vsubps_avx(auVar336,auVar16);
      auVar43._4_4_ = fVar338 * auVar248._4_4_;
      auVar43._0_4_ = fVar331 * auVar248._0_4_;
      auVar43._8_4_ = fVar340 * auVar248._8_4_;
      auVar43._12_4_ = fVar342 * auVar248._12_4_;
      auVar43._16_4_ = fVar344 * auVar248._16_4_;
      auVar43._20_4_ = fVar346 * auVar248._20_4_;
      uVar1 = auVar248._28_4_;
      auVar43._24_4_ = fVar348 * auVar248._24_4_;
      auVar43._28_4_ = uVar1;
      auVar310 = vsubps_avx(auVar89,auVar43);
      auVar44._4_4_ = (float)local_840._4_4_ * -fVar102;
      auVar44._0_4_ = (float)local_840._0_4_ * -fVar74;
      auVar44._8_4_ = fStack_838 * -fVar104;
      auVar44._12_4_ = fStack_834 * -fVar106;
      auVar44._16_4_ = fStack_830 * -fVar107;
      auVar44._20_4_ = fStack_82c * -fVar108;
      auVar44._24_4_ = fStack_828 * -fVar109;
      auVar44._28_4_ = local_8e0._28_4_ ^ 0x80000000;
      auVar45._4_4_ = (float)local_6a0._4_4_ * fVar289;
      auVar45._0_4_ = (float)local_6a0._0_4_ * fVar177;
      auVar45._8_4_ = fStack_698 * fVar184;
      auVar45._12_4_ = fStack_694 * fVar209;
      auVar45._16_4_ = fStack_690 * fVar238;
      auVar45._20_4_ = fStack_68c * fVar264;
      auVar45._24_4_ = fStack_688 * fVar11;
      auVar45._28_4_ = uVar1;
      auVar307._8_4_ = 0x3f800000;
      auVar307._0_8_ = 0x3f8000003f800000;
      auVar307._12_4_ = 0x3f800000;
      auVar307._16_4_ = 0x3f800000;
      auVar307._20_4_ = 0x3f800000;
      auVar307._24_4_ = 0x3f800000;
      auVar307._28_4_ = 0x3f800000;
      auVar89 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar338 * (float)local_a20._4_4_;
      auVar46._0_4_ = fVar331 * (float)local_a20._0_4_;
      auVar46._8_4_ = fVar340 * fStack_a18;
      auVar46._12_4_ = fVar342 * fStack_a14;
      auVar46._16_4_ = fVar344 * fStack_a10;
      auVar46._20_4_ = fVar346 * fStack_a0c;
      auVar46._24_4_ = fVar348 * fStack_a08;
      auVar46._28_4_ = uVar1;
      auVar91 = vsubps_avx(auVar89,auVar46);
      auVar89 = vrcpps_avx(auVar91);
      fVar177 = auVar89._0_4_;
      fVar235 = auVar89._4_4_;
      auVar47._4_4_ = auVar91._4_4_ * fVar235;
      auVar47._0_4_ = auVar91._0_4_ * fVar177;
      fVar178 = auVar89._8_4_;
      auVar47._8_4_ = auVar91._8_4_ * fVar178;
      fVar289 = auVar89._12_4_;
      auVar47._12_4_ = auVar91._12_4_ * fVar289;
      fVar179 = auVar89._16_4_;
      auVar47._16_4_ = auVar91._16_4_ * fVar179;
      fVar180 = auVar89._20_4_;
      auVar47._20_4_ = auVar91._20_4_ * fVar180;
      fVar184 = auVar89._24_4_;
      auVar47._24_4_ = auVar91._24_4_ * fVar184;
      auVar47._28_4_ = fStack_824;
      auVar336 = vsubps_avx(auVar307,auVar47);
      auVar89 = vandps_avx(auVar91,auVar250);
      auVar251._8_4_ = 0x219392ef;
      auVar251._0_8_ = 0x219392ef219392ef;
      auVar251._12_4_ = 0x219392ef;
      auVar251._16_4_ = 0x219392ef;
      auVar251._20_4_ = 0x219392ef;
      auVar251._24_4_ = 0x219392ef;
      auVar251._28_4_ = 0x219392ef;
      auVar248 = vcmpps_avx(auVar89,auVar251,1);
      auVar48._4_4_ = (fVar235 + fVar235 * auVar336._4_4_) * -auVar310._4_4_;
      auVar48._0_4_ = (fVar177 + fVar177 * auVar336._0_4_) * -auVar310._0_4_;
      auVar48._8_4_ = (fVar178 + fVar178 * auVar336._8_4_) * -auVar310._8_4_;
      auVar48._12_4_ = (fVar289 + fVar289 * auVar336._12_4_) * -auVar310._12_4_;
      auVar48._16_4_ = (fVar179 + fVar179 * auVar336._16_4_) * -auVar310._16_4_;
      auVar48._20_4_ = (fVar180 + fVar180 * auVar336._20_4_) * -auVar310._20_4_;
      auVar48._24_4_ = (fVar184 + fVar184 * auVar336._24_4_) * -auVar310._24_4_;
      auVar48._28_4_ = auVar310._28_4_ ^ 0x80000000;
      auVar89 = vcmpps_avx(auVar91,ZEXT832(0) << 0x20,1);
      auVar89 = vorps_avx(auVar248,auVar89);
      auVar89 = vblendvps_avx(auVar48,auVar293,auVar89);
      local_6c0 = vmaxps_avx(auVar90,auVar89);
      auVar89 = vcmpps_avx(auVar91,ZEXT832(0) << 0x20,6);
      auVar89 = vorps_avx(auVar248,auVar89);
      auVar248 = vblendvps_avx(auVar48,auVar297,auVar89);
      auVar89 = vandps_avx(auVar298._0_32_,local_4e0);
      local_440 = vminps_avx(auVar197,auVar248);
      auVar248 = vcmpps_avx(local_6c0,local_440,2);
      auVar90 = auVar89 & auVar248;
      if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar90 >> 0x7f,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0xbf,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar90[0x1f] < '\0') {
        auVar90 = vminps_avx(auVar249,local_620);
        auVar310 = vminps_avx(auVar15,local_600);
        auVar90 = vminps_avx(auVar90,auVar310);
        auVar90 = vsubps_avx(auVar90,local_680);
        auVar89 = vandps_avx(auVar248,auVar89);
        auVar61._4_4_ = fStack_3fc;
        auVar61._0_4_ = local_400;
        auVar61._8_4_ = fStack_3f8;
        auVar61._12_4_ = fStack_3f4;
        auVar61._16_4_ = fStack_3f0;
        auVar61._20_4_ = fStack_3ec;
        auVar61._24_4_ = fStack_3e8;
        auVar61._28_4_ = fStack_3e4;
        auVar248 = vminps_avx(auVar61,auVar307);
        auVar195 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar248 = vmaxps_avx(auVar248,ZEXT832(0) << 0x20);
        fVar177 = DAT_01f7b060._28_4_;
        local_1a0[0] = fVar73 + fVar110 * (auVar248._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1a0[1] = fVar101 + fVar137 * (auVar248._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1a0[2] = fVar103 + fVar138 * (auVar248._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1a0[3] = fVar105 + fVar139 * (auVar248._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_190 = fVar73 + fVar110 * (auVar248._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_18c = fVar101 + fVar137 * (auVar248._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_188 = fVar103 + fVar138 * (auVar248._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_184 = fVar105 + auVar248._28_4_ + fVar177;
        auVar62._4_4_ = fStack_3dc;
        auVar62._0_4_ = local_3e0;
        auVar62._8_4_ = fStack_3d8;
        auVar62._12_4_ = fStack_3d4;
        auVar62._16_4_ = fStack_3d0;
        auVar62._20_4_ = fStack_3cc;
        auVar62._24_4_ = fStack_3c8;
        auVar62._28_4_ = fStack_3c4;
        auVar248 = vminps_avx(auVar62,auVar307);
        auVar248 = vmaxps_avx(auVar248,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar73 + fVar110 * (auVar248._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1c0[1] = fVar101 + fVar137 * (auVar248._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1c0[2] = fVar103 + fVar138 * (auVar248._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1c0[3] = fVar105 + fVar139 * (auVar248._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_1b0 = fVar73 + fVar110 * (auVar248._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_1ac = fVar101 + fVar137 * (auVar248._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_1a8 = fVar103 + fVar138 * (auVar248._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_1a4 = fVar105 + auVar248._28_4_ + fVar177;
        auVar49._4_4_ = auVar90._4_4_ * 0.99999976;
        auVar49._0_4_ = auVar90._0_4_ * 0.99999976;
        auVar49._8_4_ = auVar90._8_4_ * 0.99999976;
        auVar49._12_4_ = auVar90._12_4_ * 0.99999976;
        auVar49._16_4_ = auVar90._16_4_ * 0.99999976;
        auVar49._20_4_ = auVar90._20_4_ * 0.99999976;
        auVar49._24_4_ = auVar90._24_4_ * 0.99999976;
        auVar49._28_4_ = 0x3f7ffffc;
        auVar248 = vmaxps_avx(ZEXT832(0) << 0x20,auVar49);
        auVar50._4_4_ = auVar248._4_4_ * auVar248._4_4_;
        auVar50._0_4_ = auVar248._0_4_ * auVar248._0_4_;
        auVar50._8_4_ = auVar248._8_4_ * auVar248._8_4_;
        auVar50._12_4_ = auVar248._12_4_ * auVar248._12_4_;
        auVar50._16_4_ = auVar248._16_4_ * auVar248._16_4_;
        auVar50._20_4_ = auVar248._20_4_ * auVar248._20_4_;
        auVar50._24_4_ = auVar248._24_4_ * auVar248._24_4_;
        auVar50._28_4_ = auVar248._28_4_;
        local_a60 = vsubps_avx(auVar17,auVar50);
        auVar51._4_4_ = local_a60._4_4_ * (float)local_660._4_4_;
        auVar51._0_4_ = local_a60._0_4_ * (float)local_660._0_4_;
        auVar51._8_4_ = local_a60._8_4_ * fStack_658;
        auVar51._12_4_ = local_a60._12_4_ * fStack_654;
        auVar51._16_4_ = local_a60._16_4_ * fStack_650;
        auVar51._20_4_ = local_a60._20_4_ * fStack_64c;
        auVar51._24_4_ = local_a60._24_4_ * fStack_648;
        auVar51._28_4_ = auVar248._28_4_;
        auVar90 = vsubps_avx(local_640,auVar51);
        auVar248 = vcmpps_avx(auVar90,ZEXT832(0) << 0x20,5);
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar248 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar248 >> 0x7f,0) == '\0') &&
              (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar248 >> 0xbf,0) == '\0') &&
            (auVar248 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar248[0x1f]) {
          auVar247 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar220 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar354 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_ae0 = ZEXT832(0) << 0x20;
          auVar280._8_4_ = 0x7f800000;
          auVar280._0_8_ = 0x7f8000007f800000;
          auVar280._12_4_ = 0x7f800000;
          auVar280._16_4_ = 0x7f800000;
          auVar280._20_4_ = 0x7f800000;
          auVar280._24_4_ = 0x7f800000;
          auVar280._28_4_ = 0x7f800000;
          auVar308._8_4_ = 0xff800000;
          auVar308._0_8_ = 0xff800000ff800000;
          auVar308._12_4_ = 0xff800000;
          auVar308._16_4_ = 0xff800000;
          auVar308._20_4_ = 0xff800000;
          auVar308._24_4_ = 0xff800000;
          auVar308._28_4_ = 0xff800000;
          _local_ac0 = _local_ae0;
          local_a60 = auVar16;
        }
        else {
          auVar310 = vrcpps_avx(local_340);
          fVar235 = auVar310._0_4_;
          auVar199._0_4_ = local_340._0_4_ * fVar235;
          fVar178 = auVar310._4_4_;
          auVar199._4_4_ = local_340._4_4_ * fVar178;
          fVar289 = auVar310._8_4_;
          auVar199._8_4_ = local_340._8_4_ * fVar289;
          fVar179 = auVar310._12_4_;
          auVar199._12_4_ = local_340._12_4_ * fVar179;
          fVar180 = auVar310._16_4_;
          auVar199._16_4_ = local_340._16_4_ * fVar180;
          fVar184 = auVar310._20_4_;
          auVar199._20_4_ = local_340._20_4_ * fVar184;
          fVar204 = auVar310._24_4_;
          auVar199._24_4_ = local_340._24_4_ * fVar204;
          auVar199._28_4_ = 0;
          auVar16 = vsubps_avx(auVar307,auVar199);
          auVar91 = vsqrtps_avx(auVar90);
          fVar235 = fVar235 + fVar235 * auVar16._0_4_;
          fVar178 = fVar178 + fVar178 * auVar16._4_4_;
          fVar289 = fVar289 + fVar289 * auVar16._8_4_;
          fVar179 = fVar179 + fVar179 * auVar16._12_4_;
          fVar180 = fVar180 + fVar180 * auVar16._16_4_;
          fVar184 = fVar184 + fVar184 * auVar16._20_4_;
          fVar204 = fVar204 + fVar204 * auVar16._24_4_;
          auVar197 = vsubps_avx(local_320,auVar91);
          auVar254._0_4_ = auVar197._0_4_ * fVar235;
          auVar254._4_4_ = auVar197._4_4_ * fVar178;
          auVar254._8_4_ = auVar197._8_4_ * fVar289;
          auVar254._12_4_ = auVar197._12_4_ * fVar179;
          auVar254._16_4_ = auVar197._16_4_ * fVar180;
          auVar254._20_4_ = auVar197._20_4_ * fVar184;
          auVar254._28_36_ = auVar298._28_36_;
          auVar254._24_4_ = auVar197._24_4_ * fVar204;
          auVar197 = vsubps_avx(auVar91,local_9a0);
          fVar235 = auVar197._0_4_ * fVar235;
          fVar178 = auVar197._4_4_ * fVar178;
          auVar52._4_4_ = fVar178;
          auVar52._0_4_ = fVar235;
          fVar289 = auVar197._8_4_ * fVar289;
          auVar52._8_4_ = fVar289;
          fVar179 = auVar197._12_4_ * fVar179;
          auVar52._12_4_ = fVar179;
          fVar180 = auVar197._16_4_ * fVar180;
          auVar52._16_4_ = fVar180;
          fVar184 = auVar197._20_4_ * fVar184;
          auVar52._20_4_ = fVar184;
          fVar204 = auVar197._24_4_ * fVar204;
          auVar52._24_4_ = fVar204;
          auVar52._28_4_ = fVar139;
          fVar205 = (auVar254._0_4_ * local_540 + local_5c0) * local_5a0;
          fVar209 = (auVar254._4_4_ * fStack_53c + fStack_5bc) * fStack_59c;
          fVar211 = (auVar254._8_4_ * fStack_538 + fStack_5b8) * fStack_598;
          fVar232 = (auVar254._12_4_ * fStack_534 + fStack_5b4) * fStack_594;
          fVar238 = (auVar254._16_4_ * fStack_530 + fStack_5b0) * fStack_590;
          fVar239 = (auVar254._20_4_ * fStack_52c + fStack_5ac) * fStack_58c;
          fVar240 = (auVar254._24_4_ * fStack_528 + fStack_5a8) * fStack_588;
          auVar148._0_4_ = fVar241 + fVar205 * fVar233;
          auVar148._4_4_ = fVar256 + fVar209 * fVar288;
          auVar148._8_4_ = fVar259 + fVar211 * fVar183;
          auVar148._12_4_ = fVar262 + fVar232 * fVar208;
          auVar148._16_4_ = fVar265 + fVar238 * fVar237;
          auVar148._20_4_ = fVar268 + fVar239 * fVar261;
          auVar148._24_4_ = fVar271 + fVar240 * fVar10;
          auVar148._28_4_ = fVar273 + auVar310._28_4_ + auVar16._28_4_ + fStack_5a4;
          auVar53._4_4_ = auVar254._4_4_ * (float)local_a20._4_4_;
          auVar53._0_4_ = auVar254._0_4_ * (float)local_a20._0_4_;
          auVar53._8_4_ = auVar254._8_4_ * fStack_a18;
          auVar53._12_4_ = auVar254._12_4_ * fStack_a14;
          auVar53._16_4_ = auVar254._16_4_ * fStack_a10;
          auVar53._20_4_ = auVar254._20_4_ * fStack_a0c;
          auVar53._24_4_ = auVar254._24_4_ * fStack_a08;
          auVar53._28_4_ = auVar91._28_4_;
          local_940 = vsubps_avx(auVar53,auVar148);
          auVar226._0_4_ = auVar351._0_4_ + fVar205 * fVar231;
          auVar226._4_4_ = auVar351._4_4_ + fVar209 * fVar282;
          auVar226._8_4_ = auVar351._8_4_ + fVar211 * fVar181;
          auVar226._12_4_ = auVar351._12_4_ + fVar232 * fVar206;
          auVar226._16_4_ = auVar351._16_4_ + fVar238 * fVar234;
          auVar226._20_4_ = auVar351._20_4_ + fVar239 * fVar255;
          auVar226._24_4_ = auVar351._24_4_ + fVar240 * fVar8;
          auVar226._28_4_ = auVar351._28_4_ + auVar91._28_4_;
          auVar63._4_4_ = (float)local_6a0._4_4_ * auVar254._4_4_;
          auVar63._0_4_ = (float)local_6a0._0_4_ * auVar254._0_4_;
          auVar63._8_4_ = fStack_698 * auVar254._8_4_;
          auVar63._12_4_ = fStack_694 * auVar254._12_4_;
          auVar63._16_4_ = fStack_690 * auVar254._16_4_;
          auVar63._20_4_ = fStack_68c * auVar254._20_4_;
          auVar63._24_4_ = fStack_688 * auVar254._24_4_;
          auVar63._28_4_ = fVar177;
          _local_ac0 = vsubps_avx(auVar63,auVar226);
          auVar200._0_4_ = local_2e0._0_4_ + fVar176 * fVar205;
          auVar200._4_4_ = local_2e0._4_4_ + fVar287 * fVar209;
          auVar200._8_4_ = local_2e0._8_4_ + fVar182 * fVar211;
          auVar200._12_4_ = local_2e0._12_4_ + fVar207 * fVar232;
          auVar200._16_4_ = local_2e0._16_4_ + fVar236 * fVar238;
          auVar200._20_4_ = local_2e0._20_4_ + fVar258 * fVar239;
          auVar200._24_4_ = local_2e0._24_4_ + fVar9 * fVar240;
          auVar200._28_4_ = local_2e0._28_4_ + auVar197._28_4_;
          auVar54._4_4_ = auVar254._4_4_ * (float)local_840._4_4_;
          auVar54._0_4_ = auVar254._0_4_ * (float)local_840._0_4_;
          auVar54._8_4_ = auVar254._8_4_ * fStack_838;
          auVar54._12_4_ = auVar254._12_4_ * fStack_834;
          auVar54._16_4_ = auVar254._16_4_ * fStack_830;
          auVar54._20_4_ = auVar254._20_4_ * fStack_82c;
          auVar54._24_4_ = auVar254._24_4_ * fStack_828;
          auVar54._28_4_ = auVar226._28_4_;
          _local_ae0 = vsubps_avx(auVar54,auVar200);
          fVar205 = (fVar235 * local_540 + local_5c0) * local_5a0;
          fVar209 = (fVar178 * fStack_53c + fStack_5bc) * fStack_59c;
          fVar211 = (fVar289 * fStack_538 + fStack_5b8) * fStack_598;
          fVar232 = (fVar179 * fStack_534 + fStack_5b4) * fStack_594;
          fVar238 = (fVar180 * fStack_530 + fStack_5b0) * fStack_590;
          fVar239 = (fVar184 * fStack_52c + fStack_5ac) * fStack_58c;
          fVar240 = (fVar204 * fStack_528 + fStack_5a8) * fStack_588;
          auVar201._0_4_ = fVar241 + fVar205 * fVar233;
          auVar201._4_4_ = fVar256 + fVar209 * fVar288;
          auVar201._8_4_ = fVar259 + fVar211 * fVar183;
          auVar201._12_4_ = fVar262 + fVar232 * fVar208;
          auVar201._16_4_ = fVar265 + fVar238 * fVar237;
          auVar201._20_4_ = fVar268 + fVar239 * fVar261;
          auVar201._24_4_ = fVar271 + fVar240 * fVar10;
          auVar201._28_4_ = fVar273 + local_ae0._28_4_ + fStack_5a4;
          auVar55._4_4_ = fVar178 * (float)local_a20._4_4_;
          auVar55._0_4_ = fVar235 * (float)local_a20._0_4_;
          auVar55._8_4_ = fVar289 * fStack_a18;
          auVar55._12_4_ = fVar179 * fStack_a14;
          auVar55._16_4_ = fVar180 * fStack_a10;
          auVar55._20_4_ = fVar184 * fStack_a0c;
          auVar55._24_4_ = fVar204 * fStack_a08;
          auVar55._28_4_ = fVar177;
          auVar310 = vsubps_avx(auVar55,auVar201);
          auVar195 = auVar310._0_28_;
          auVar252._0_4_ = auVar351._0_4_ + fVar205 * fVar231;
          auVar252._4_4_ = auVar351._4_4_ + fVar209 * fVar282;
          auVar252._8_4_ = auVar351._8_4_ + fVar211 * fVar181;
          auVar252._12_4_ = auVar351._12_4_ + fVar232 * fVar206;
          auVar252._16_4_ = auVar351._16_4_ + fVar238 * fVar234;
          auVar252._20_4_ = auVar351._20_4_ + fVar239 * fVar255;
          auVar252._24_4_ = auVar351._24_4_ + fVar240 * fVar8;
          auVar252._28_4_ = auVar351._28_4_ + fVar177;
          auVar56._4_4_ = (float)local_6a0._4_4_ * fVar178;
          auVar56._0_4_ = (float)local_6a0._0_4_ * fVar235;
          auVar56._8_4_ = fStack_698 * fVar289;
          auVar56._12_4_ = fStack_694 * fVar179;
          auVar56._16_4_ = fStack_690 * fVar180;
          auVar56._20_4_ = fStack_68c * fVar184;
          auVar56._24_4_ = fStack_688 * fVar204;
          auVar56._28_4_ = fStack_a04;
          auVar310 = vsubps_avx(auVar56,auVar252);
          auVar247 = auVar310._0_28_;
          auVar227._0_4_ = local_2e0._0_4_ + fVar176 * fVar205;
          auVar227._4_4_ = local_2e0._4_4_ + fVar287 * fVar209;
          auVar227._8_4_ = local_2e0._8_4_ + fVar182 * fVar211;
          auVar227._12_4_ = local_2e0._12_4_ + fVar207 * fVar232;
          auVar227._16_4_ = local_2e0._16_4_ + fVar236 * fVar238;
          auVar227._20_4_ = local_2e0._20_4_ + fVar258 * fVar239;
          auVar227._24_4_ = local_2e0._24_4_ + fVar9 * fVar240;
          auVar227._28_4_ = local_2e0._28_4_ + auVar226._28_4_;
          auVar57._4_4_ = fVar178 * (float)local_840._4_4_;
          auVar57._0_4_ = fVar235 * (float)local_840._0_4_;
          auVar57._8_4_ = fVar289 * fStack_838;
          auVar57._12_4_ = fVar179 * fStack_834;
          auVar57._16_4_ = fVar180 * fStack_830;
          auVar57._20_4_ = fVar184 * fStack_82c;
          auVar57._24_4_ = fVar204 * fStack_828;
          auVar57._28_4_ = fStack_a04;
          auVar310 = vsubps_avx(auVar57,auVar227);
          auVar220 = auVar310._0_28_;
          auVar90 = vcmpps_avx(auVar90,ZEXT832(0) << 0x20,5);
          auVar281._8_4_ = 0x7f800000;
          auVar281._0_8_ = 0x7f8000007f800000;
          auVar281._12_4_ = 0x7f800000;
          auVar281._16_4_ = 0x7f800000;
          auVar281._20_4_ = 0x7f800000;
          auVar281._24_4_ = 0x7f800000;
          auVar281._28_4_ = 0x7f800000;
          auVar280 = vblendvps_avx(auVar281,auVar254._0_32_,auVar90);
          auVar310 = vmaxps_avx(local_580,local_420);
          auVar58._4_4_ = auVar310._4_4_ * 1.9073486e-06;
          auVar58._0_4_ = auVar310._0_4_ * 1.9073486e-06;
          auVar58._8_4_ = auVar310._8_4_ * 1.9073486e-06;
          auVar58._12_4_ = auVar310._12_4_ * 1.9073486e-06;
          auVar58._16_4_ = auVar310._16_4_ * 1.9073486e-06;
          auVar58._20_4_ = auVar310._20_4_ * 1.9073486e-06;
          auVar58._24_4_ = auVar310._24_4_ * 1.9073486e-06;
          auVar58._28_4_ = auVar310._28_4_;
          auVar310 = vcmpps_avx(local_980,auVar58,1);
          auVar309._8_4_ = 0xff800000;
          auVar309._0_8_ = 0xff800000ff800000;
          auVar309._12_4_ = 0xff800000;
          auVar309._16_4_ = 0xff800000;
          auVar309._20_4_ = 0xff800000;
          auVar309._24_4_ = 0xff800000;
          auVar309._28_4_ = 0xff800000;
          auVar308 = vblendvps_avx(auVar309,auVar52,auVar90);
          auVar91 = auVar90 & auVar310;
          if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar91 >> 0x7f,0) != '\0') ||
                (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar91 >> 0xbf,0) != '\0') ||
              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar91[0x1f] < '\0') {
            auVar248 = vandps_avx(auVar310,auVar90);
            auVar163 = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
            auVar91 = vcmpps_avx(local_a60,_DAT_01f7b000,2);
            auVar136._8_4_ = 0xff800000;
            auVar136._0_8_ = 0xff800000ff800000;
            auVar136._12_4_ = 0xff800000;
            auVar136._16_4_ = 0xff800000;
            auVar136._20_4_ = 0xff800000;
            auVar136._24_4_ = 0xff800000;
            auVar136._28_4_ = 0xff800000;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar310 = vblendvps_avx(auVar152,auVar136,auVar91);
            auVar76 = vpmovsxwd_avx(auVar163);
            auVar163 = vpunpckhwd_avx(auVar163,auVar163);
            auVar352._16_16_ = auVar163;
            auVar352._0_16_ = auVar76;
            auVar280 = vblendvps_avx(auVar280,auVar310,auVar352);
            auVar310 = vblendvps_avx(auVar136,auVar152,auVar91);
            auVar308 = vblendvps_avx(auVar308,auVar310,auVar352);
            auVar175._0_8_ = auVar248._0_8_ ^ 0xffffffffffffffff;
            auVar175._8_4_ = auVar248._8_4_ ^ 0xffffffff;
            auVar175._12_4_ = auVar248._12_4_ ^ 0xffffffff;
            auVar175._16_4_ = auVar248._16_4_ ^ 0xffffffff;
            auVar175._20_4_ = auVar248._20_4_ ^ 0xffffffff;
            auVar175._24_4_ = auVar248._24_4_ ^ 0xffffffff;
            auVar175._28_4_ = auVar248._28_4_ ^ 0xffffffff;
            auVar248 = vorps_avx(auVar91,auVar175);
            auVar248 = vandps_avx(auVar90,auVar248);
          }
          auVar354 = local_940._0_28_;
        }
        _local_4a0 = local_6c0;
        local_480 = vminps_avx(local_440,auVar280);
        _local_7c0 = vmaxps_avx(local_6c0,auVar308);
        _local_460 = _local_7c0;
        auVar90 = vcmpps_avx(local_6c0,local_480,2);
        local_600 = vandps_avx(auVar89,auVar90);
        auVar90 = vcmpps_avx(_local_7c0,local_440,2);
        local_800 = vandps_avx(auVar89,auVar90);
        auVar89 = vorps_avx(local_800,local_600);
        if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar89 >> 0x7f,0) != '\0') ||
              (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar89 >> 0xbf,0) != '\0') ||
            (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar89[0x1f] < '\0') {
          auStack_878 = auVar15._8_24_;
          auVar128._0_8_ = auVar248._0_8_ ^ 0xffffffffffffffff;
          auVar128._8_4_ = auVar248._8_4_ ^ 0xffffffff;
          auVar128._12_4_ = auVar248._12_4_ ^ 0xffffffff;
          auVar128._16_4_ = auVar248._16_4_ ^ 0xffffffff;
          auVar128._20_4_ = auVar248._20_4_ ^ 0xffffffff;
          auVar128._24_4_ = auVar248._24_4_ ^ 0xffffffff;
          fVar158 = auVar248._28_4_;
          auVar128._28_4_ = (uint)fVar158 ^ 0xffffffff;
          auVar97._0_4_ =
               (float)local_a20._0_4_ * auVar195._0_4_ +
               (float)local_6a0._0_4_ * auVar247._0_4_ + (float)local_840._0_4_ * auVar220._0_4_;
          auVar97._4_4_ =
               (float)local_a20._4_4_ * auVar195._4_4_ +
               (float)local_6a0._4_4_ * auVar247._4_4_ + (float)local_840._4_4_ * auVar220._4_4_;
          auVar97._8_4_ =
               fStack_a18 * auVar195._8_4_ +
               fStack_698 * auVar247._8_4_ + fStack_838 * auVar220._8_4_;
          auVar97._12_4_ =
               fStack_a14 * auVar195._12_4_ +
               fStack_694 * auVar247._12_4_ + fStack_834 * auVar220._12_4_;
          auVar97._16_4_ =
               fStack_a10 * auVar195._16_4_ +
               fStack_690 * auVar247._16_4_ + fStack_830 * auVar220._16_4_;
          auVar97._20_4_ =
               fStack_a0c * auVar195._20_4_ +
               fStack_68c * auVar247._20_4_ + fStack_82c * auVar220._20_4_;
          auVar97._24_4_ =
               fStack_a08 * auVar195._24_4_ +
               fStack_688 * auVar247._24_4_ + fStack_828 * auVar220._24_4_;
          auVar97._28_4_ = fVar158 + local_800._28_4_ + auVar89._28_4_;
          auVar202._8_4_ = 0x7fffffff;
          auVar202._0_8_ = 0x7fffffff7fffffff;
          auVar202._12_4_ = 0x7fffffff;
          auVar202._16_4_ = 0x7fffffff;
          auVar202._20_4_ = 0x7fffffff;
          auVar202._24_4_ = 0x7fffffff;
          auVar202._28_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar97,auVar202);
          auVar228._8_4_ = 0x3e99999a;
          auVar228._0_8_ = 0x3e99999a3e99999a;
          auVar228._12_4_ = 0x3e99999a;
          auVar228._16_4_ = 0x3e99999a;
          auVar228._20_4_ = 0x3e99999a;
          auVar228._24_4_ = 0x3e99999a;
          auVar228._28_4_ = 0x3e99999a;
          auVar89 = vcmpps_avx(auVar89,auVar228,1);
          local_640 = vorps_avx(auVar89,auVar128);
          auVar98._0_4_ =
               auVar354._0_4_ * (float)local_a20._0_4_ +
               (float)local_6a0._0_4_ * (float)local_ac0._0_4_ +
               (float)local_840._0_4_ * (float)local_ae0._0_4_;
          auVar98._4_4_ =
               auVar354._4_4_ * (float)local_a20._4_4_ +
               (float)local_6a0._4_4_ * (float)local_ac0._4_4_ +
               (float)local_840._4_4_ * (float)local_ae0._4_4_;
          auVar98._8_4_ =
               auVar354._8_4_ * fStack_a18 + fStack_698 * fStack_ab8 + fStack_838 * fStack_ad8;
          auVar98._12_4_ =
               auVar354._12_4_ * fStack_a14 + fStack_694 * fStack_ab4 + fStack_834 * fStack_ad4;
          auVar98._16_4_ =
               auVar354._16_4_ * fStack_a10 + fStack_690 * fStack_ab0 + fStack_830 * fStack_ad0;
          auVar98._20_4_ =
               auVar354._20_4_ * fStack_a0c + fStack_68c * fStack_aac + fStack_82c * fStack_acc;
          auVar98._24_4_ =
               auVar354._24_4_ * fStack_a08 + fStack_688 * fStack_aa8 + fStack_828 * fStack_ac8;
          auVar98._28_4_ = local_640._28_4_ + local_600._28_4_ + fVar158;
          auVar89 = vandps_avx(auVar98,auVar202);
          auVar89 = vcmpps_avx(auVar89,auVar228,1);
          auVar89 = vorps_avx(auVar89,auVar128);
          auVar129._8_4_ = 3;
          auVar129._0_8_ = 0x300000003;
          auVar129._12_4_ = 3;
          auVar129._16_4_ = 3;
          auVar129._20_4_ = 3;
          auVar129._24_4_ = 3;
          auVar129._28_4_ = 3;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar89 = vblendvps_avx(auVar150,auVar129,auVar89);
          _local_660 = ZEXT432(local_c68);
          auVar76 = vpshufd_avx(ZEXT416(local_c68),0);
          auVar163 = vpcmpgtd_avx(auVar89._16_16_,auVar76);
          local_680._0_16_ = auVar76;
          auVar76 = vpcmpgtd_avx(auVar89._0_16_,auVar76);
          auVar130._16_16_ = auVar163;
          auVar130._0_16_ = auVar76;
          local_620 = vblendps_avx(ZEXT1632(auVar76),auVar130,0xf0);
          auVar89 = vandnps_avx(local_620,local_600);
          local_7e0._4_4_ = local_6c0._4_4_ + (float)local_860._4_4_;
          local_7e0._0_4_ = local_6c0._0_4_ + (float)local_860._0_4_;
          fStack_7d8 = local_6c0._8_4_ + fStack_858;
          fStack_7d4 = local_6c0._12_4_ + fStack_854;
          fStack_7d0 = local_6c0._16_4_ + fStack_850;
          fStack_7cc = local_6c0._20_4_ + fStack_84c;
          fStack_7c8 = local_6c0._24_4_ + fStack_848;
          fStack_7c4 = local_6c0._28_4_ + fStack_844;
          while( true ) {
            local_4c0 = auVar89;
            local_b40 = auVar112._0_4_;
            fStack_b3c = auVar112._4_4_;
            fStack_b38 = auVar112._8_4_;
            fStack_b34 = auVar112._12_4_;
            local_b20 = auVar14._0_4_;
            fStack_b1c = auVar14._4_4_;
            fStack_b18 = auVar14._8_4_;
            fStack_b14 = auVar14._12_4_;
            local_b30 = auVar77._0_4_;
            fStack_b2c = auVar77._4_4_;
            fStack_b28 = auVar77._8_4_;
            fStack_b24 = auVar77._12_4_;
            local_b50 = auVar13._0_4_;
            fStack_b4c = auVar13._4_4_;
            fStack_b48 = auVar13._8_4_;
            fStack_b44 = auVar13._12_4_;
            if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar89 >> 0x7f,0) == '\0') &&
                  (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar89 >> 0xbf,0) == '\0') &&
                (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar89[0x1f]) break;
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar248 = vblendvps_avx(auVar131,local_6c0,auVar89);
            auVar90 = vshufps_avx(auVar248,auVar248,0xb1);
            auVar90 = vminps_avx(auVar248,auVar90);
            auVar310 = vshufpd_avx(auVar90,auVar90,5);
            auVar90 = vminps_avx(auVar90,auVar310);
            auVar310 = vperm2f128_avx(auVar90,auVar90,1);
            auVar90 = vminps_avx(auVar90,auVar310);
            auVar248 = vcmpps_avx(auVar248,auVar90,0);
            auVar90 = auVar89 & auVar248;
            if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar90 >> 0x7f,0) != '\0') ||
                  (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar90 >> 0xbf,0) != '\0') ||
                (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar90[0x1f] < '\0') {
              auVar89 = vandps_avx(auVar248,auVar89);
            }
            uVar65 = vmovmskps_avx(auVar89);
            uVar70 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar67 = (ulong)uVar70;
            *(undefined4 *)(local_4c0 + uVar67 * 4) = 0;
            fVar158 = local_1a0[uVar67];
            uVar70 = *(uint *)(local_4a0 + uVar67 * 4);
            fVar231 = auVar113._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar231 = sqrtf((float)local_9c0._0_4_);
            }
            auVar76 = vminps_avx(auVar14,auVar112);
            auVar163 = vmaxps_avx(auVar14,auVar112);
            auVar75 = vminps_avx(auVar77,auVar13);
            auVar80 = vminps_avx(auVar76,auVar75);
            auVar76 = vmaxps_avx(auVar77,auVar13);
            auVar75 = vmaxps_avx(auVar163,auVar76);
            auVar159._8_4_ = 0x7fffffff;
            auVar159._0_8_ = 0x7fffffff7fffffff;
            auVar159._12_4_ = 0x7fffffff;
            auVar163 = vandps_avx(auVar80,auVar159);
            auVar76 = vandps_avx(auVar75,auVar159);
            auVar163 = vmaxps_avx(auVar163,auVar76);
            auVar76 = vmovshdup_avx(auVar163);
            auVar76 = vmaxss_avx(auVar76,auVar163);
            auVar163 = vshufpd_avx(auVar163,auVar163,1);
            auVar163 = vmaxss_avx(auVar163,auVar76);
            local_ac0._0_4_ = auVar163._0_4_ * 1.9073486e-06;
            local_a60._0_4_ = fVar231 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar75,auVar75,0xff);
            auVar163 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar158),0x10);
            auVar254 = ZEXT1664(auVar163);
            lVar66 = 5;
            do {
              do {
                bVar72 = lVar66 == 0;
                lVar66 = lVar66 + -1;
                if (bVar72) goto LAB_008370e6;
                auVar76 = auVar254._0_16_;
                auVar163 = vmovshdup_avx(auVar76);
                fVar181 = auVar163._0_4_;
                fVar177 = 1.0 - fVar181;
                auVar163 = vshufps_avx(auVar76,auVar76,0x55);
                fVar158 = auVar163._0_4_;
                fVar231 = auVar163._4_4_;
                fVar176 = auVar163._8_4_;
                fVar233 = auVar163._12_4_;
                auVar163 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
                fVar235 = auVar163._0_4_;
                fVar178 = auVar163._4_4_;
                fVar282 = auVar163._8_4_;
                fVar287 = auVar163._12_4_;
                fVar288 = local_b30 * fVar158 + local_b40 * fVar235;
                fVar289 = fStack_b2c * fVar231 + fStack_b3c * fVar178;
                fVar179 = fStack_b28 * fVar176 + fStack_b38 * fVar282;
                fVar180 = fStack_b24 * fVar233 + fStack_b34 * fVar287;
                auVar215._0_4_ =
                     fVar235 * (local_b40 * fVar158 + fVar235 * local_b20) + fVar158 * fVar288;
                auVar215._4_4_ =
                     fVar178 * (fStack_b3c * fVar231 + fVar178 * fStack_b1c) + fVar231 * fVar289;
                auVar215._8_4_ =
                     fVar282 * (fStack_b38 * fVar176 + fVar282 * fStack_b18) + fVar176 * fVar179;
                auVar215._12_4_ =
                     fVar287 * (fStack_b34 * fVar233 + fVar287 * fStack_b14) + fVar233 * fVar180;
                auVar160._0_4_ =
                     fVar235 * fVar288 + fVar158 * (fVar158 * local_b50 + local_b30 * fVar235);
                auVar160._4_4_ =
                     fVar178 * fVar289 + fVar231 * (fVar231 * fStack_b4c + fStack_b2c * fVar178);
                auVar160._8_4_ =
                     fVar282 * fVar179 + fVar176 * (fVar176 * fStack_b48 + fStack_b28 * fVar282);
                auVar160._12_4_ =
                     fVar287 * fVar180 + fVar233 * (fVar233 * fStack_b44 + fStack_b24 * fVar287);
                auVar163 = vshufps_avx(auVar76,auVar76,0);
                auVar115._0_4_ = auVar163._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar115._4_4_ = auVar163._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar115._8_4_ = auVar163._8_4_ * fStack_9a8 + 0.0;
                auVar115._12_4_ = auVar163._12_4_ * fStack_9a4 + 0.0;
                auVar79._0_4_ = fVar235 * auVar215._0_4_ + fVar158 * auVar160._0_4_;
                auVar79._4_4_ = fVar178 * auVar215._4_4_ + fVar231 * auVar160._4_4_;
                auVar79._8_4_ = fVar282 * auVar215._8_4_ + fVar176 * auVar160._8_4_;
                auVar79._12_4_ = fVar287 * auVar215._12_4_ + fVar233 * auVar160._12_4_;
                local_940._0_16_ = auVar79;
                auVar163 = vsubps_avx(auVar115,auVar79);
                _local_ae0 = auVar163;
                auVar163 = vdpps_avx(auVar163,auVar163,0x7f);
                fVar158 = auVar163._0_4_;
                if (fVar158 < 0.0) {
                  local_a80._0_16_ = auVar160;
                  fVar231 = sqrtf(fVar158);
                  auVar254 = ZEXT1664(auVar76);
                  auVar160 = local_a80._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar163,auVar163);
                  fVar231 = auVar75._0_4_;
                }
                auVar75 = vsubps_avx(auVar160,auVar215);
                auVar277._0_4_ = auVar75._0_4_ * 3.0;
                auVar277._4_4_ = auVar75._4_4_ * 3.0;
                auVar277._8_4_ = auVar75._8_4_ * 3.0;
                auVar277._12_4_ = auVar75._12_4_ * 3.0;
                auVar75 = vshufps_avx(ZEXT416((uint)(fVar181 * 6.0)),ZEXT416((uint)(fVar181 * 6.0)),
                                      0);
                auVar80 = ZEXT416((uint)((fVar177 - (fVar181 + fVar181)) * 6.0));
                auVar142 = vshufps_avx(auVar80,auVar80,0);
                auVar80 = ZEXT416((uint)((fVar181 - (fVar177 + fVar177)) * 6.0));
                auVar111 = vshufps_avx(auVar80,auVar80,0);
                auVar140 = vshufps_avx(ZEXT416((uint)(fVar177 * 6.0)),ZEXT416((uint)(fVar177 * 6.0))
                                       ,0);
                auVar80 = vdpps_avx(auVar277,auVar277,0x7f);
                auVar116._0_4_ =
                     auVar140._0_4_ * local_b20 +
                     auVar111._0_4_ * local_b40 +
                     auVar75._0_4_ * local_b50 + auVar142._0_4_ * local_b30;
                auVar116._4_4_ =
                     auVar140._4_4_ * fStack_b1c +
                     auVar111._4_4_ * fStack_b3c +
                     auVar75._4_4_ * fStack_b4c + auVar142._4_4_ * fStack_b2c;
                auVar116._8_4_ =
                     auVar140._8_4_ * fStack_b18 +
                     auVar111._8_4_ * fStack_b38 +
                     auVar75._8_4_ * fStack_b48 + auVar142._8_4_ * fStack_b28;
                auVar116._12_4_ =
                     auVar140._12_4_ * fStack_b14 +
                     auVar111._12_4_ * fStack_b34 +
                     auVar75._12_4_ * fStack_b44 + auVar142._12_4_ * fStack_b24;
                auVar75 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
                auVar142 = vrsqrtss_avx(auVar75,auVar75);
                fVar233 = auVar142._0_4_;
                fVar176 = auVar80._0_4_;
                auVar142 = vdpps_avx(auVar277,auVar116,0x7f);
                auVar111 = vshufps_avx(auVar80,auVar80,0);
                auVar117._0_4_ = auVar116._0_4_ * auVar111._0_4_;
                auVar117._4_4_ = auVar116._4_4_ * auVar111._4_4_;
                auVar117._8_4_ = auVar116._8_4_ * auVar111._8_4_;
                auVar117._12_4_ = auVar116._12_4_ * auVar111._12_4_;
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar187._0_4_ = auVar277._0_4_ * auVar142._0_4_;
                auVar187._4_4_ = auVar277._4_4_ * auVar142._4_4_;
                auVar187._8_4_ = auVar277._8_4_ * auVar142._8_4_;
                auVar187._12_4_ = auVar277._12_4_ * auVar142._12_4_;
                auVar140 = vsubps_avx(auVar117,auVar187);
                auVar142 = vrcpss_avx(auVar75,auVar75);
                auVar75 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                     ZEXT416((uint)(auVar254._0_4_ * (float)local_a60._0_4_)));
                auVar142 = ZEXT416((uint)(auVar142._0_4_ * (2.0 - fVar176 * auVar142._0_4_)));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                uVar67 = CONCAT44(auVar277._4_4_,auVar277._0_4_);
                auVar216._0_8_ = uVar67 ^ 0x8000000080000000;
                auVar216._8_4_ = -auVar277._8_4_;
                auVar216._12_4_ = -auVar277._12_4_;
                auVar111 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar176 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar161._0_4_ = auVar111._0_4_ * auVar140._0_4_ * auVar142._0_4_;
                auVar161._4_4_ = auVar111._4_4_ * auVar140._4_4_ * auVar142._4_4_;
                auVar161._8_4_ = auVar111._8_4_ * auVar140._8_4_ * auVar142._8_4_;
                auVar161._12_4_ = auVar111._12_4_ * auVar140._12_4_ * auVar142._12_4_;
                auVar245._0_4_ = auVar277._0_4_ * auVar111._0_4_;
                auVar245._4_4_ = auVar277._4_4_ * auVar111._4_4_;
                auVar245._8_4_ = auVar277._8_4_ * auVar111._8_4_;
                auVar245._12_4_ = auVar277._12_4_ * auVar111._12_4_;
                if (fVar176 < 0.0) {
                  local_a80._0_16_ = auVar216;
                  local_8e0._0_16_ = auVar245;
                  local_a00._0_16_ = auVar161;
                  fVar176 = sqrtf(fVar176);
                  auVar161 = local_a00._0_16_;
                  auVar216 = local_a80._0_16_;
                  auVar245 = local_8e0._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar176 = auVar80._0_4_;
                }
                auVar80 = vdpps_avx(_local_ae0,auVar245,0x7f);
                fVar231 = ((float)local_ac0._0_4_ / fVar176) * (fVar231 + 1.0) +
                          auVar75._0_4_ + fVar231 * (float)local_ac0._0_4_;
                auVar142 = vdpps_avx(auVar216,auVar245,0x7f);
                auVar111 = vdpps_avx(_local_ae0,auVar161,0x7f);
                auVar140 = vdpps_avx(_local_9b0,auVar245,0x7f);
                auVar141 = vdpps_avx(_local_ae0,auVar216,0x7f);
                fVar176 = auVar142._0_4_ + auVar111._0_4_;
                fVar233 = auVar80._0_4_;
                auVar81._0_4_ = fVar233 * fVar233;
                auVar81._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar81._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar81._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar111 = vsubps_avx(auVar163,auVar81);
                auVar142 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar177 = auVar141._0_4_ - fVar233 * fVar176;
                fVar235 = auVar142._0_4_ - fVar233 * auVar140._0_4_;
                auVar142 = vrsqrtss_avx(auVar111,auVar111);
                fVar178 = auVar111._0_4_;
                fVar233 = auVar142._0_4_;
                fVar233 = fVar233 * 1.5 + fVar178 * -0.5 * fVar233 * fVar233 * fVar233;
                if (fVar178 < 0.0) {
                  local_a80._0_4_ = fVar231;
                  local_8e0._0_16_ = auVar140;
                  local_a00._0_16_ = ZEXT416((uint)fVar176);
                  local_900._0_4_ = fVar177;
                  local_980._0_4_ = fVar235;
                  local_9a0._0_4_ = fVar233;
                  fVar178 = sqrtf(fVar178);
                  fVar233 = (float)local_9a0._0_4_;
                  fVar177 = (float)local_900._0_4_;
                  fVar235 = (float)local_980._0_4_;
                  auVar140 = local_8e0._0_16_;
                  fVar231 = (float)local_a80._0_4_;
                  auVar142 = local_a00._0_16_;
                }
                else {
                  auVar142 = vsqrtss_avx(auVar111,auVar111);
                  fVar178 = auVar142._0_4_;
                  auVar142 = ZEXT416((uint)fVar176);
                }
                auVar141 = vpermilps_avx(local_940._0_16_,0xff);
                auVar86 = vshufps_avx(auVar277,auVar277,0xff);
                fVar176 = fVar177 * fVar233 - auVar86._0_4_;
                auVar188._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar188._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar188._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar217._0_4_ = -fVar176;
                auVar217._4_4_ = 0x80000000;
                auVar217._8_4_ = 0x80000000;
                auVar217._12_4_ = 0x80000000;
                auVar111 = vinsertps_avx(auVar217,ZEXT416((uint)(fVar235 * fVar233)),0x1c);
                auVar140 = vmovsldup_avx(ZEXT416((uint)(auVar142._0_4_ * fVar235 * fVar233 -
                                                       auVar140._0_4_ * fVar176)));
                auVar111 = vdivps_avx(auVar111,auVar140);
                auVar142 = vinsertps_avx(auVar142,auVar188,0x10);
                auVar142 = vdivps_avx(auVar142,auVar140);
                auVar140 = vmovsldup_avx(auVar80);
                auVar82 = ZEXT416((uint)(fVar178 - auVar141._0_4_));
                auVar141 = vmovsldup_avx(auVar82);
                auVar143._0_4_ = auVar140._0_4_ * auVar111._0_4_ + auVar141._0_4_ * auVar142._0_4_;
                auVar143._4_4_ = auVar140._4_4_ * auVar111._4_4_ + auVar141._4_4_ * auVar142._4_4_;
                auVar143._8_4_ = auVar140._8_4_ * auVar111._8_4_ + auVar141._8_4_ * auVar142._8_4_;
                auVar143._12_4_ =
                     auVar140._12_4_ * auVar111._12_4_ + auVar141._12_4_ * auVar142._12_4_;
                auVar142 = vsubps_avx(auVar76,auVar143);
                auVar254 = ZEXT1664(auVar142);
                auVar144._8_4_ = 0x7fffffff;
                auVar144._0_8_ = 0x7fffffff7fffffff;
                auVar144._12_4_ = 0x7fffffff;
                auVar76 = vandps_avx(auVar80,auVar144);
              } while (fVar231 <= auVar76._0_4_);
              auVar162._8_4_ = 0x7fffffff;
              auVar162._0_8_ = 0x7fffffff7fffffff;
              auVar162._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx(auVar82,auVar162);
            } while ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar75._0_4_ + fVar231 <=
                     auVar76._0_4_);
            fVar231 = auVar142._0_4_ + (float)local_8b0._0_4_;
            if ((fVar210 <= fVar231) &&
               (fVar176 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar176)) {
              auVar76 = vmovshdup_avx(auVar142);
              fVar233 = auVar76._0_4_;
              if ((0.0 <= fVar233) && (fVar233 <= 1.0)) {
                auVar163 = vrsqrtss_avx(auVar163,auVar163);
                fVar177 = auVar163._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar163 = ZEXT416((uint)(fVar177 * 1.5 +
                                           fVar158 * -0.5 * fVar177 * fVar177 * fVar177));
                  auVar163 = vshufps_avx(auVar163,auVar163,0);
                  auVar164._0_4_ = auVar163._0_4_ * (float)local_ae0._0_4_;
                  auVar164._4_4_ = auVar163._4_4_ * (float)local_ae0._4_4_;
                  auVar164._8_4_ = auVar163._8_4_ * fStack_ad8;
                  auVar164._12_4_ = auVar163._12_4_ * fStack_ad4;
                  auVar118._0_4_ = auVar277._0_4_ + auVar86._0_4_ * auVar164._0_4_;
                  auVar118._4_4_ = auVar277._4_4_ + auVar86._4_4_ * auVar164._4_4_;
                  auVar118._8_4_ = auVar277._8_4_ + auVar86._8_4_ * auVar164._8_4_;
                  auVar118._12_4_ = auVar277._12_4_ + auVar86._12_4_ * auVar164._12_4_;
                  auVar163 = vshufps_avx(auVar164,auVar164,0xc9);
                  auVar76 = vshufps_avx(auVar277,auVar277,0xc9);
                  auVar165._0_4_ = auVar76._0_4_ * auVar164._0_4_;
                  auVar165._4_4_ = auVar76._4_4_ * auVar164._4_4_;
                  auVar165._8_4_ = auVar76._8_4_ * auVar164._8_4_;
                  auVar165._12_4_ = auVar76._12_4_ * auVar164._12_4_;
                  auVar189._0_4_ = auVar277._0_4_ * auVar163._0_4_;
                  auVar189._4_4_ = auVar277._4_4_ * auVar163._4_4_;
                  auVar189._8_4_ = auVar277._8_4_ * auVar163._8_4_;
                  auVar189._12_4_ = auVar277._12_4_ * auVar163._12_4_;
                  auVar75 = vsubps_avx(auVar189,auVar165);
                  auVar163 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar76 = vshufps_avx(auVar118,auVar118,0xc9);
                  auVar190._0_4_ = auVar76._0_4_ * auVar163._0_4_;
                  auVar190._4_4_ = auVar76._4_4_ * auVar163._4_4_;
                  auVar190._8_4_ = auVar76._8_4_ * auVar163._8_4_;
                  auVar190._12_4_ = auVar76._12_4_ * auVar163._12_4_;
                  auVar163 = vshufps_avx(auVar75,auVar75,0xd2);
                  auVar119._0_4_ = auVar118._0_4_ * auVar163._0_4_;
                  auVar119._4_4_ = auVar118._4_4_ * auVar163._4_4_;
                  auVar119._8_4_ = auVar118._8_4_ * auVar163._8_4_;
                  auVar119._12_4_ = auVar118._12_4_ * auVar163._12_4_;
                  auVar163 = vsubps_avx(auVar190,auVar119);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar231;
                    uVar1 = vextractps_avx(auVar163,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar163,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar163._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar233;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_880;
                    *(uint *)(ray + k * 4 + 0x120) = uVar64;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar142,auVar142,0x55);
                    auVar76 = vshufps_avx(auVar163,auVar163,0x55);
                    auStack_750 = vshufps_avx(auVar163,auVar163,0xaa);
                    local_740 = vshufps_avx(auVar163,auVar163,0);
                    local_760 = (RTCHitN  [16])auVar76;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar70 = context->user->instPrimID[0];
                    auVar120._4_4_ = uVar70;
                    auVar120._0_4_ = uVar70;
                    auVar120._8_4_ = uVar70;
                    auVar120._12_4_ = uVar70;
                    auStack_6e0 = auVar120;
                    *(float *)(ray + k * 4 + 0x80) = fVar231;
                    local_820._0_16_ = *local_a28;
                    local_b10.valid = (int *)local_820;
                    local_b10.geometryUserPtr = pGVar3->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    auVar163 = *local_a28;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b10);
                      auVar353._8_56_ = extraout_var;
                      auVar353._0_8_ = extraout_XMM1_Qa;
                      auVar120 = auVar353._0_16_;
                      auVar163 = local_820._0_16_;
                    }
                    if (auVar163 == (undefined1  [16])0x0) {
                      auVar76 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar163 = vpcmpeqd_avx(auVar120,auVar120);
                      auVar76 = auVar76 ^ auVar163;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar75 = vpcmpeqd_avx(auVar76,auVar76);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_b10);
                        auVar75 = vpcmpeqd_avx(auVar75,auVar75);
                        auVar163 = local_820._0_16_;
                      }
                      auVar80 = vpcmpeqd_avx(auVar163,_DAT_01f45a50);
                      auVar76 = auVar80 ^ auVar75;
                      if (auVar163 != (undefined1  [16])0x0) {
                        auVar80 = auVar80 ^ auVar75;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar163;
                        auVar163 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar163;
                      }
                    }
                    auVar83._8_8_ = 0x100000001;
                    auVar83._0_8_ = 0x100000001;
                    if ((auVar83 & auVar76) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar176;
                    }
                  }
                }
              }
            }
LAB_008370e6:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar285._4_4_ = uVar1;
            auVar285._0_4_ = uVar1;
            auVar285._8_4_ = uVar1;
            auVar285._12_4_ = uVar1;
            auVar285._16_4_ = uVar1;
            auVar285._20_4_ = uVar1;
            auVar285._24_4_ = uVar1;
            auVar285._28_4_ = uVar1;
            auVar353 = ZEXT3264(auVar285);
            auVar89 = vcmpps_avx(_local_7e0,auVar285,2);
            auVar89 = vandps_avx(auVar89,local_4c0);
          }
          auVar99._0_4_ = (float)local_860._0_4_ + (float)local_7c0._0_4_;
          auVar99._4_4_ = (float)local_860._4_4_ + (float)local_7c0._4_4_;
          auVar99._8_4_ = fStack_858 + fStack_7b8;
          auVar99._12_4_ = fStack_854 + fStack_7b4;
          auVar99._16_4_ = fStack_850 + fStack_7b0;
          auVar99._20_4_ = fStack_84c + fStack_7ac;
          auVar99._24_4_ = fStack_848 + fStack_7a8;
          auVar99._28_4_ = fStack_844 + fStack_7a4;
          auVar163 = vshufps_avx(auVar353._0_16_,auVar353._0_16_,0);
          auVar132._16_16_ = auVar163;
          auVar132._0_16_ = auVar163;
          auVar89 = vcmpps_avx(auVar99,auVar132,2);
          _local_7e0 = vandps_avx(auVar89,local_800);
          auVar100._8_4_ = 3;
          auVar100._0_8_ = 0x300000003;
          auVar100._12_4_ = 3;
          auVar100._16_4_ = 3;
          auVar100._20_4_ = 3;
          auVar100._24_4_ = 3;
          auVar100._28_4_ = 3;
          auVar133._8_4_ = 2;
          auVar133._0_8_ = 0x200000002;
          auVar133._12_4_ = 2;
          auVar133._16_4_ = 2;
          auVar133._20_4_ = 2;
          auVar133._24_4_ = 2;
          auVar133._28_4_ = 2;
          auVar89 = vblendvps_avx(auVar133,auVar100,local_640);
          auVar163 = vpcmpgtd_avx(auVar89._16_16_,local_680._0_16_);
          auVar76 = vpshufd_avx(_local_660,0);
          auVar76 = vpcmpgtd_avx(auVar89._0_16_,auVar76);
          auVar134._16_16_ = auVar163;
          auVar134._0_16_ = auVar76;
          local_800 = vblendps_avx(ZEXT1632(auVar76),auVar134,0xf0);
          local_820 = vandnps_avx(local_800,_local_7e0);
          local_6c0 = _local_460;
          local_7c0._4_4_ = (float)local_860._4_4_ + (float)local_460._4_4_;
          local_7c0._0_4_ = (float)local_860._0_4_ + (float)local_460._0_4_;
          fStack_7b8 = fStack_858 + fStack_458;
          fStack_7b4 = fStack_854 + fStack_454;
          fStack_7b0 = fStack_850 + fStack_450;
          fStack_7ac = fStack_84c + fStack_44c;
          fStack_7a8 = fStack_848 + fStack_448;
          fStack_7a4 = fStack_844 + fStack_444;
          auVar298 = ZEXT3264(local_9e0);
          auVar311 = ZEXT3264(local_aa0);
          auVar254 = ZEXT3264(local_960);
          for (; (((((((local_820 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_820 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_820 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_820 >> 0x7f,0) != '\0') ||
                   (local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_820 >> 0xbf,0) != '\0') ||
                 (local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_820[0x1f] < '\0'; local_820 = vandps_avx(auVar89,local_820)) {
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar89 = vblendvps_avx(auVar135,local_6c0,local_820);
            auVar248 = vshufps_avx(auVar89,auVar89,0xb1);
            auVar248 = vminps_avx(auVar89,auVar248);
            auVar90 = vshufpd_avx(auVar248,auVar248,5);
            auVar248 = vminps_avx(auVar248,auVar90);
            auVar90 = vperm2f128_avx(auVar248,auVar248,1);
            auVar248 = vminps_avx(auVar248,auVar90);
            auVar248 = vcmpps_avx(auVar89,auVar248,0);
            auVar90 = local_820 & auVar248;
            auVar89 = local_820;
            if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar90 >> 0x7f,0) != '\0') ||
                  (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar90 >> 0xbf,0) != '\0') ||
                (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar90[0x1f] < '\0') {
              auVar89 = vandps_avx(auVar248,local_820);
            }
            uVar65 = vmovmskps_avx(auVar89);
            uVar70 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar67 = (ulong)uVar70;
            *(undefined4 *)(local_820 + uVar67 * 4) = 0;
            fVar158 = local_1c0[uVar67];
            uVar70 = *(uint *)(local_440 + uVar67 * 4);
            fVar231 = auVar12._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar231 = sqrtf((float)local_9c0._0_4_);
              auVar254 = ZEXT3264(local_960);
              auVar311 = ZEXT3264(local_aa0);
              auVar298 = ZEXT3264(local_9e0);
            }
            auVar76 = vminps_avx(auVar14,auVar112);
            auVar163 = vmaxps_avx(auVar14,auVar112);
            auVar75 = vminps_avx(auVar77,auVar13);
            auVar80 = vminps_avx(auVar76,auVar75);
            auVar76 = vmaxps_avx(auVar77,auVar13);
            auVar75 = vmaxps_avx(auVar163,auVar76);
            auVar166._8_4_ = 0x7fffffff;
            auVar166._0_8_ = 0x7fffffff7fffffff;
            auVar166._12_4_ = 0x7fffffff;
            auVar163 = vandps_avx(auVar80,auVar166);
            auVar76 = vandps_avx(auVar75,auVar166);
            auVar163 = vmaxps_avx(auVar163,auVar76);
            auVar76 = vmovshdup_avx(auVar163);
            auVar76 = vmaxss_avx(auVar76,auVar163);
            auVar163 = vshufpd_avx(auVar163,auVar163,1);
            auVar163 = vmaxss_avx(auVar163,auVar76);
            local_ac0._0_4_ = auVar163._0_4_ * 1.9073486e-06;
            local_8e0._0_4_ = fVar231 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar75,auVar75,0xff);
            auVar163 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar158),0x10);
            auVar353 = ZEXT1664(auVar163);
            lVar66 = 5;
            do {
              do {
                bVar72 = lVar66 == 0;
                lVar66 = lVar66 + -1;
                if (bVar72) goto LAB_00837c5f;
                auVar76 = auVar353._0_16_;
                auVar163 = vmovshdup_avx(auVar76);
                fVar181 = auVar163._0_4_;
                fVar177 = 1.0 - fVar181;
                auVar163 = vshufps_avx(auVar76,auVar76,0x55);
                fVar158 = auVar163._0_4_;
                fVar231 = auVar163._4_4_;
                fVar176 = auVar163._8_4_;
                fVar233 = auVar163._12_4_;
                auVar163 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
                fVar235 = auVar163._0_4_;
                fVar178 = auVar163._4_4_;
                fVar282 = auVar163._8_4_;
                fVar287 = auVar163._12_4_;
                fVar288 = local_b30 * fVar158 + local_b40 * fVar235;
                fVar289 = fStack_b2c * fVar231 + fStack_b3c * fVar178;
                fVar179 = fStack_b28 * fVar176 + fStack_b38 * fVar282;
                fVar180 = fStack_b24 * fVar233 + fStack_b34 * fVar287;
                auVar218._0_4_ =
                     fVar235 * (local_b40 * fVar158 + fVar235 * local_b20) + fVar158 * fVar288;
                auVar218._4_4_ =
                     fVar178 * (fStack_b3c * fVar231 + fVar178 * fStack_b1c) + fVar231 * fVar289;
                auVar218._8_4_ =
                     fVar282 * (fStack_b38 * fVar176 + fVar282 * fStack_b18) + fVar176 * fVar179;
                auVar218._12_4_ =
                     fVar287 * (fStack_b34 * fVar233 + fVar287 * fStack_b14) + fVar233 * fVar180;
                auVar167._0_4_ =
                     fVar235 * fVar288 + fVar158 * (fVar158 * local_b50 + local_b30 * fVar235);
                auVar167._4_4_ =
                     fVar178 * fVar289 + fVar231 * (fVar231 * fStack_b4c + fStack_b2c * fVar178);
                auVar167._8_4_ =
                     fVar282 * fVar179 + fVar176 * (fVar176 * fStack_b48 + fStack_b28 * fVar282);
                auVar167._12_4_ =
                     fVar287 * fVar180 + fVar233 * (fVar233 * fStack_b44 + fStack_b24 * fVar287);
                auVar163 = vshufps_avx(auVar76,auVar76,0);
                auVar121._0_4_ = auVar163._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar121._4_4_ = auVar163._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar121._8_4_ = auVar163._8_4_ * fStack_9a8 + 0.0;
                auVar121._12_4_ = auVar163._12_4_ * fStack_9a4 + 0.0;
                auVar84._0_4_ = fVar235 * auVar218._0_4_ + fVar158 * auVar167._0_4_;
                auVar84._4_4_ = fVar178 * auVar218._4_4_ + fVar231 * auVar167._4_4_;
                auVar84._8_4_ = fVar282 * auVar218._8_4_ + fVar176 * auVar167._8_4_;
                auVar84._12_4_ = fVar287 * auVar218._12_4_ + fVar233 * auVar167._12_4_;
                local_940._0_16_ = auVar84;
                auVar163 = vsubps_avx(auVar121,auVar84);
                _local_ae0 = auVar163;
                auVar163 = vdpps_avx(auVar163,auVar163,0x7f);
                fVar158 = auVar163._0_4_;
                if (fVar158 < 0.0) {
                  local_a60._0_16_ = auVar218;
                  fVar231 = sqrtf(fVar158);
                  auVar353 = ZEXT1664(auVar76);
                  auVar218 = local_a60._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar163,auVar163);
                  fVar231 = auVar75._0_4_;
                }
                auVar75 = vsubps_avx(auVar167,auVar218);
                auVar246._0_4_ = auVar75._0_4_ * 3.0;
                auVar246._4_4_ = auVar75._4_4_ * 3.0;
                auVar246._8_4_ = auVar75._8_4_ * 3.0;
                auVar246._12_4_ = auVar75._12_4_ * 3.0;
                auVar75 = vshufps_avx(ZEXT416((uint)(fVar181 * 6.0)),ZEXT416((uint)(fVar181 * 6.0)),
                                      0);
                auVar80 = ZEXT416((uint)((fVar177 - (fVar181 + fVar181)) * 6.0));
                auVar142 = vshufps_avx(auVar80,auVar80,0);
                auVar80 = ZEXT416((uint)((fVar181 - (fVar177 + fVar177)) * 6.0));
                auVar111 = vshufps_avx(auVar80,auVar80,0);
                auVar140 = vshufps_avx(ZEXT416((uint)(fVar177 * 6.0)),ZEXT416((uint)(fVar177 * 6.0))
                                       ,0);
                auVar80 = vdpps_avx(auVar246,auVar246,0x7f);
                auVar122._0_4_ =
                     auVar140._0_4_ * local_b20 +
                     auVar111._0_4_ * local_b40 +
                     auVar75._0_4_ * local_b50 + auVar142._0_4_ * local_b30;
                auVar122._4_4_ =
                     auVar140._4_4_ * fStack_b1c +
                     auVar111._4_4_ * fStack_b3c +
                     auVar75._4_4_ * fStack_b4c + auVar142._4_4_ * fStack_b2c;
                auVar122._8_4_ =
                     auVar140._8_4_ * fStack_b18 +
                     auVar111._8_4_ * fStack_b38 +
                     auVar75._8_4_ * fStack_b48 + auVar142._8_4_ * fStack_b28;
                auVar122._12_4_ =
                     auVar140._12_4_ * fStack_b14 +
                     auVar111._12_4_ * fStack_b34 +
                     auVar75._12_4_ * fStack_b44 + auVar142._12_4_ * fStack_b24;
                auVar75 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
                auVar142 = vrsqrtss_avx(auVar75,auVar75);
                fVar233 = auVar142._0_4_;
                fVar176 = auVar80._0_4_;
                auVar142 = vdpps_avx(auVar246,auVar122,0x7f);
                auVar111 = vshufps_avx(auVar80,auVar80,0);
                auVar123._0_4_ = auVar122._0_4_ * auVar111._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar111._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar111._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar111._12_4_;
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar191._0_4_ = auVar246._0_4_ * auVar142._0_4_;
                auVar191._4_4_ = auVar246._4_4_ * auVar142._4_4_;
                auVar191._8_4_ = auVar246._8_4_ * auVar142._8_4_;
                auVar191._12_4_ = auVar246._12_4_ * auVar142._12_4_;
                auVar140 = vsubps_avx(auVar123,auVar191);
                auVar142 = vrcpss_avx(auVar75,auVar75);
                auVar75 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                     ZEXT416((uint)(auVar353._0_4_ * (float)local_8e0._0_4_)));
                auVar142 = ZEXT416((uint)(auVar142._0_4_ * (2.0 - fVar176 * auVar142._0_4_)));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                uVar67 = CONCAT44(auVar246._4_4_,auVar246._0_4_);
                auVar283._0_8_ = uVar67 ^ 0x8000000080000000;
                auVar283._8_4_ = -auVar246._8_4_;
                auVar283._12_4_ = -auVar246._12_4_;
                auVar111 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar176 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar168._0_4_ = auVar111._0_4_ * auVar140._0_4_ * auVar142._0_4_;
                auVar168._4_4_ = auVar111._4_4_ * auVar140._4_4_ * auVar142._4_4_;
                auVar168._8_4_ = auVar111._8_4_ * auVar140._8_4_ * auVar142._8_4_;
                auVar168._12_4_ = auVar111._12_4_ * auVar140._12_4_ * auVar142._12_4_;
                local_a80._0_4_ = auVar246._0_4_ * auVar111._0_4_;
                local_a80._4_4_ = auVar246._4_4_ * auVar111._4_4_;
                local_a80._8_4_ = auVar246._8_4_ * auVar111._8_4_;
                local_a80._12_4_ = auVar246._12_4_ * auVar111._12_4_;
                if (fVar176 < 0.0) {
                  local_a60._0_4_ = fVar231;
                  local_a00._0_16_ = auVar168;
                  fVar176 = sqrtf(fVar176);
                  auVar168 = local_a00._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar176 = auVar80._0_4_;
                  local_a60._0_4_ = fVar231;
                }
                auVar80 = vdpps_avx(_local_ae0,local_a80._0_16_,0x7f);
                fVar231 = ((float)local_ac0._0_4_ / fVar176) * ((float)local_a60._0_4_ + 1.0) +
                          auVar75._0_4_ + (float)local_a60._0_4_ * (float)local_ac0._0_4_;
                auVar142 = vdpps_avx(auVar283,local_a80._0_16_,0x7f);
                auVar111 = vdpps_avx(_local_ae0,auVar168,0x7f);
                auVar140 = vdpps_avx(_local_9b0,local_a80._0_16_,0x7f);
                auVar141 = vdpps_avx(_local_ae0,auVar283,0x7f);
                fVar176 = auVar142._0_4_ + auVar111._0_4_;
                fVar233 = auVar80._0_4_;
                auVar85._0_4_ = fVar233 * fVar233;
                auVar85._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar85._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar85._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar111 = vsubps_avx(auVar163,auVar85);
                local_a80._0_16_ = ZEXT416((uint)fVar176);
                auVar142 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar177 = auVar141._0_4_ - fVar233 * fVar176;
                local_a60._0_16_ = auVar80;
                fVar233 = auVar142._0_4_ - fVar233 * auVar140._0_4_;
                auVar80 = vrsqrtss_avx(auVar111,auVar111);
                fVar235 = auVar111._0_4_;
                fVar176 = auVar80._0_4_;
                fVar176 = fVar176 * 1.5 + fVar235 * -0.5 * fVar176 * fVar176 * fVar176;
                if (fVar235 < 0.0) {
                  local_a00._0_16_ = auVar140;
                  local_900._0_4_ = fVar177;
                  local_980._0_4_ = fVar233;
                  local_9a0._0_4_ = fVar176;
                  fVar235 = sqrtf(fVar235);
                  fVar176 = (float)local_9a0._0_4_;
                  fVar177 = (float)local_900._0_4_;
                  fVar233 = (float)local_980._0_4_;
                  auVar140 = local_a00._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar111,auVar111);
                  fVar235 = auVar80._0_4_;
                }
                auVar298 = ZEXT3264(local_9e0);
                auVar311 = ZEXT3264(local_aa0);
                auVar86 = vpermilps_avx(local_940._0_16_,0xff);
                auVar141 = vshufps_avx(auVar246,auVar246,0xff);
                fVar177 = fVar177 * fVar176 - auVar141._0_4_;
                auVar192._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar219._0_4_ = -fVar177;
                auVar219._4_4_ = 0x80000000;
                auVar219._8_4_ = 0x80000000;
                auVar219._12_4_ = 0x80000000;
                auVar80 = vinsertps_avx(auVar219,ZEXT416((uint)(fVar233 * fVar176)),0x1c);
                auVar111 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar233 * fVar176 -
                                                       auVar140._0_4_ * fVar177)));
                auVar80 = vdivps_avx(auVar80,auVar111);
                auVar142 = vinsertps_avx(local_a80._0_16_,auVar192,0x10);
                auVar142 = vdivps_avx(auVar142,auVar111);
                auVar111 = vmovsldup_avx(local_a60._0_16_);
                auVar86 = ZEXT416((uint)(fVar235 - auVar86._0_4_));
                auVar140 = vmovsldup_avx(auVar86);
                auVar145._0_4_ = auVar111._0_4_ * auVar80._0_4_ + auVar140._0_4_ * auVar142._0_4_;
                auVar145._4_4_ = auVar111._4_4_ * auVar80._4_4_ + auVar140._4_4_ * auVar142._4_4_;
                auVar145._8_4_ = auVar111._8_4_ * auVar80._8_4_ + auVar140._8_4_ * auVar142._8_4_;
                auVar145._12_4_ =
                     auVar111._12_4_ * auVar80._12_4_ + auVar140._12_4_ * auVar142._12_4_;
                auVar80 = vsubps_avx(auVar76,auVar145);
                auVar353 = ZEXT1664(auVar80);
                auVar146._8_4_ = 0x7fffffff;
                auVar146._0_8_ = 0x7fffffff7fffffff;
                auVar146._12_4_ = 0x7fffffff;
                auVar76 = vandps_avx(local_a60._0_16_,auVar146);
                auVar254 = ZEXT3264(local_960);
              } while (fVar231 <= auVar76._0_4_);
              auVar169._8_4_ = 0x7fffffff;
              auVar169._0_8_ = 0x7fffffff7fffffff;
              auVar169._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx(auVar86,auVar169);
            } while ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar75._0_4_ + fVar231 <=
                     auVar76._0_4_);
            fVar231 = auVar80._0_4_ + (float)local_8b0._0_4_;
            if ((fVar210 <= fVar231) &&
               (fVar176 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar176)) {
              auVar76 = vmovshdup_avx(auVar80);
              fVar233 = auVar76._0_4_;
              if ((0.0 <= fVar233) && (fVar233 <= 1.0)) {
                auVar163 = vrsqrtss_avx(auVar163,auVar163);
                fVar177 = auVar163._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar163 = ZEXT416((uint)(fVar177 * 1.5 +
                                           fVar158 * -0.5 * fVar177 * fVar177 * fVar177));
                  auVar163 = vshufps_avx(auVar163,auVar163,0);
                  auVar170._0_4_ = auVar163._0_4_ * (float)local_ae0._0_4_;
                  auVar170._4_4_ = auVar163._4_4_ * (float)local_ae0._4_4_;
                  auVar170._8_4_ = auVar163._8_4_ * fStack_ad8;
                  auVar170._12_4_ = auVar163._12_4_ * fStack_ad4;
                  auVar124._0_4_ = auVar246._0_4_ + auVar141._0_4_ * auVar170._0_4_;
                  auVar124._4_4_ = auVar246._4_4_ + auVar141._4_4_ * auVar170._4_4_;
                  auVar124._8_4_ = auVar246._8_4_ + auVar141._8_4_ * auVar170._8_4_;
                  auVar124._12_4_ = auVar246._12_4_ + auVar141._12_4_ * auVar170._12_4_;
                  auVar163 = vshufps_avx(auVar170,auVar170,0xc9);
                  auVar76 = vshufps_avx(auVar246,auVar246,0xc9);
                  auVar171._0_4_ = auVar76._0_4_ * auVar170._0_4_;
                  auVar171._4_4_ = auVar76._4_4_ * auVar170._4_4_;
                  auVar171._8_4_ = auVar76._8_4_ * auVar170._8_4_;
                  auVar171._12_4_ = auVar76._12_4_ * auVar170._12_4_;
                  auVar193._0_4_ = auVar246._0_4_ * auVar163._0_4_;
                  auVar193._4_4_ = auVar246._4_4_ * auVar163._4_4_;
                  auVar193._8_4_ = auVar246._8_4_ * auVar163._8_4_;
                  auVar193._12_4_ = auVar246._12_4_ * auVar163._12_4_;
                  auVar75 = vsubps_avx(auVar193,auVar171);
                  auVar163 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar76 = vshufps_avx(auVar124,auVar124,0xc9);
                  auVar194._0_4_ = auVar76._0_4_ * auVar163._0_4_;
                  auVar194._4_4_ = auVar76._4_4_ * auVar163._4_4_;
                  auVar194._8_4_ = auVar76._8_4_ * auVar163._8_4_;
                  auVar194._12_4_ = auVar76._12_4_ * auVar163._12_4_;
                  auVar163 = vshufps_avx(auVar75,auVar75,0xd2);
                  auVar125._0_4_ = auVar124._0_4_ * auVar163._0_4_;
                  auVar125._4_4_ = auVar124._4_4_ * auVar163._4_4_;
                  auVar125._8_4_ = auVar124._8_4_ * auVar163._8_4_;
                  auVar125._12_4_ = auVar124._12_4_ * auVar163._12_4_;
                  auVar163 = vsubps_avx(auVar194,auVar125);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar231;
                    uVar1 = vextractps_avx(auVar163,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar163,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar163._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar233;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_880;
                    *(uint *)(ray + k * 4 + 0x120) = uVar64;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar80,auVar80,0x55);
                    auVar76 = vshufps_avx(auVar163,auVar163,0x55);
                    auStack_750 = vshufps_avx(auVar163,auVar163,0xaa);
                    local_740 = vshufps_avx(auVar163,auVar163,0);
                    local_760 = (RTCHitN  [16])auVar76;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar70 = context->user->instPrimID[0];
                    auVar126._4_4_ = uVar70;
                    auVar126._0_4_ = uVar70;
                    auVar126._8_4_ = uVar70;
                    auVar126._12_4_ = uVar70;
                    auStack_6e0 = auVar126;
                    *(float *)(ray + k * 4 + 0x80) = fVar231;
                    local_8a0 = *local_a28;
                    local_b10.valid = (int *)local_8a0;
                    local_b10.geometryUserPtr = pGVar3->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b10);
                      auVar298._8_56_ = extraout_var_00;
                      auVar298._0_8_ = extraout_XMM1_Qa_00;
                      auVar126 = auVar298._0_16_;
                      auVar254 = ZEXT3264(local_960);
                      auVar311 = ZEXT3264(local_aa0);
                      auVar298 = ZEXT3264(local_9e0);
                    }
                    if (local_8a0 == (undefined1  [16])0x0) {
                      auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar76 = vpcmpeqd_avx(auVar126,auVar126);
                      auVar163 = auVar163 ^ auVar76;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar76 = vpcmpeqd_avx(auVar76,auVar76);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_b10);
                        auVar254 = ZEXT3264(local_960);
                        auVar311 = ZEXT3264(local_aa0);
                        auVar298 = ZEXT3264(local_9e0);
                        auVar76 = vpcmpeqd_avx(auVar76,auVar76);
                      }
                      auVar75 = vpcmpeqd_avx(local_8a0,_DAT_01f45a50);
                      auVar163 = auVar75 ^ auVar76;
                      if (local_8a0 != (undefined1  [16])0x0) {
                        auVar75 = auVar75 ^ auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar76;
                        auVar76 = vmaskmovps_avx(auVar75,*(undefined1 (*) [16])
                                                          (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar76;
                      }
                    }
                    auVar87._8_8_ = 0x100000001;
                    auVar87._0_8_ = 0x100000001;
                    if ((auVar87 & auVar163) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar176;
                    }
                  }
                }
              }
            }
LAB_00837c5f:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar286._4_4_ = uVar1;
            auVar286._0_4_ = uVar1;
            auVar286._8_4_ = uVar1;
            auVar286._12_4_ = uVar1;
            auVar286._16_4_ = uVar1;
            auVar286._20_4_ = uVar1;
            auVar286._24_4_ = uVar1;
            auVar286._28_4_ = uVar1;
            auVar353 = ZEXT3264(auVar286);
            auVar89 = vcmpps_avx(_local_7c0,auVar286,2);
          }
          auVar89 = vandps_avx(local_620,local_600);
          auVar248 = vandps_avx(local_800,_local_7e0);
          auVar151._0_4_ = (float)local_860._0_4_ + local_4a0._0_4_;
          auVar151._4_4_ = (float)local_860._4_4_ + local_4a0._4_4_;
          auVar151._8_4_ = fStack_858 + local_4a0._8_4_;
          auVar151._12_4_ = fStack_854 + local_4a0._12_4_;
          auVar151._16_4_ = fStack_850 + local_4a0._16_4_;
          auVar151._20_4_ = fStack_84c + local_4a0._20_4_;
          auVar151._24_4_ = fStack_848 + local_4a0._24_4_;
          auVar151._28_4_ = fStack_844 + local_4a0._28_4_;
          auVar163 = vshufps_avx(auVar353._0_16_,auVar353._0_16_,0);
          auVar203._16_16_ = auVar163;
          auVar203._0_16_ = auVar163;
          auVar90 = vcmpps_avx(auVar151,auVar203,2);
          auVar89 = vandps_avx(auVar90,auVar89);
          auVar229._0_4_ = (float)local_860._0_4_ + local_460._0_4_;
          auVar229._4_4_ = (float)local_860._4_4_ + local_460._4_4_;
          auVar229._8_4_ = fStack_858 + local_460._8_4_;
          auVar229._12_4_ = fStack_854 + local_460._12_4_;
          auVar229._16_4_ = fStack_850 + local_460._16_4_;
          auVar229._20_4_ = fStack_84c + local_460._20_4_;
          auVar229._24_4_ = fStack_848 + local_460._24_4_;
          auVar229._28_4_ = fStack_844 + local_460._28_4_;
          auVar90 = vcmpps_avx(auVar229,auVar203,2);
          auVar248 = vandps_avx(auVar90,auVar248);
          auVar248 = vorps_avx(auVar89,auVar248);
          if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar248 >> 0x7f,0) != '\0') ||
                (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar248 >> 0xbf,0) != '\0') ||
              (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar248[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar69 * 0x60) = auVar248;
            auVar89 = vblendvps_avx(_local_460,_local_4a0,auVar89);
            *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x60) = auVar89;
            uVar67 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar69 * 0xc] = uVar67;
            auStack_138[uVar69 * 0x18] = local_c68 + 1;
            uVar69 = (ulong)((int)uVar69 + 1);
          }
          auVar353 = ZEXT3264(local_920);
          fVar158 = (float)local_860._0_4_;
          fVar329 = (float)local_860._4_4_;
          fVar153 = fStack_858;
          fVar154 = fStack_854;
          fVar155 = fStack_850;
          fVar156 = fStack_84c;
          fVar157 = fStack_848;
          fVar242 = fStack_844;
          goto LAB_008366cf;
        }
      }
      auVar298 = ZEXT3264(local_9e0);
      auVar353 = ZEXT3264(local_920);
      auVar311 = ZEXT3264(local_aa0);
      auVar254 = ZEXT3264(local_960);
    }
LAB_008366cf:
    while( true ) {
      auVar248 = local_560;
      uVar70 = (uint)uVar69;
      if (uVar70 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar88._4_4_ = uVar1;
        auVar88._0_4_ = uVar1;
        auVar88._8_4_ = uVar1;
        auVar88._12_4_ = uVar1;
        auVar7 = vcmpps_avx(local_5e0,auVar88,2);
        uVar64 = vmovmskps_avx(auVar7);
        uVar64 = (uint)uVar71 & uVar64;
        goto LAB_0083556e;
      }
      uVar69 = (ulong)(uVar70 - 1);
      lVar66 = uVar69 * 0x60;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + lVar66);
      auVar96._0_4_ = fVar158 + auVar89._0_4_;
      auVar96._4_4_ = fVar329 + auVar89._4_4_;
      auVar96._8_4_ = fVar153 + auVar89._8_4_;
      auVar96._12_4_ = fVar154 + auVar89._12_4_;
      auVar96._16_4_ = fVar155 + auVar89._16_4_;
      auVar96._20_4_ = fVar156 + auVar89._20_4_;
      auVar96._24_4_ = fVar157 + auVar89._24_4_;
      auVar96._28_4_ = fVar242 + auVar89._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar174._4_4_ = uVar1;
      auVar174._0_4_ = uVar1;
      auVar174._8_4_ = uVar1;
      auVar174._12_4_ = uVar1;
      auVar174._16_4_ = uVar1;
      auVar174._20_4_ = uVar1;
      auVar174._24_4_ = uVar1;
      auVar174._28_4_ = uVar1;
      auVar310 = vcmpps_avx(auVar96,auVar174,2);
      auVar90 = vandps_avx(auVar310,*(undefined1 (*) [32])(auStack_180 + lVar66));
      _local_760 = auVar90;
      auVar310 = *(undefined1 (*) [32])(auStack_180 + lVar66) & auVar310;
      if ((((((((auVar310 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar310 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar310 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar310 >> 0x7f,0) != '\0') ||
            (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar310 >> 0xbf,0) != '\0') ||
          (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar310[0x1f] < '\0') break;
      uVar69 = (ulong)(uVar70 - 1);
    }
    auVar149._8_4_ = 0x7f800000;
    auVar149._0_8_ = 0x7f8000007f800000;
    auVar149._12_4_ = 0x7f800000;
    auVar149._16_4_ = 0x7f800000;
    auVar149._20_4_ = 0x7f800000;
    auVar149._24_4_ = 0x7f800000;
    auVar149._28_4_ = 0x7f800000;
    auVar89 = vblendvps_avx(auVar149,auVar89,auVar90);
    auVar310 = vshufps_avx(auVar89,auVar89,0xb1);
    auVar310 = vminps_avx(auVar89,auVar310);
    auVar91 = vshufpd_avx(auVar310,auVar310,5);
    auVar310 = vminps_avx(auVar310,auVar91);
    auVar91 = vperm2f128_avx(auVar310,auVar310,1);
    auVar310 = vminps_avx(auVar310,auVar91);
    auVar89 = vcmpps_avx(auVar89,auVar310,0);
    auVar310 = auVar90 & auVar89;
    if ((((((((auVar310 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar310 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar310 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar310 >> 0x7f,0) != '\0') ||
          (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar310 >> 0xbf,0) != '\0') ||
        (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar310[0x1f] < '\0') {
      auVar90 = vandps_avx(auVar89,auVar90);
    }
    auVar114._8_8_ = 0;
    auVar114._0_8_ = (&uStack_140)[uVar69 * 0xc];
    local_c68 = auStack_138[uVar69 * 0x18];
    uVar68 = vmovmskps_avx(auVar90);
    uVar65 = 0;
    if (uVar68 != 0) {
      for (; (uVar68 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar65 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar66) = _local_760;
    uVar68 = uVar70 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar68 = uVar70;
    }
    auVar163 = vshufps_avx(auVar114,auVar114,0);
    auVar76 = vshufps_avx(auVar114,auVar114,0x55);
    auVar76 = vsubps_avx(auVar76,auVar163);
    local_4a0._4_4_ = auVar163._4_4_ + auVar76._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar163._0_4_ + auVar76._0_4_ * 0.0;
    fStack_498 = auVar163._8_4_ + auVar76._8_4_ * 0.2857143;
    fStack_494 = auVar163._12_4_ + auVar76._12_4_ * 0.42857146;
    fStack_490 = auVar163._0_4_ + auVar76._0_4_ * 0.5714286;
    fStack_48c = auVar163._4_4_ + auVar76._4_4_ * 0.71428573;
    fStack_488 = auVar163._8_4_ + auVar76._8_4_ * 0.8571429;
    fStack_484 = auVar163._12_4_ + auVar76._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar65 * 4);
    uVar69 = (ulong)uVar68;
    auVar310 = auVar311._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }